

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniminer_tests.cpp
# Opt level: O1

void __thiscall miniminer_tests::miniminer_overlap::test_method(miniminer_overlap *this)

{
  long lVar1;
  CTxMemPool *this_00;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  CTxMemPoolEntry *pCVar3;
  uchar *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint256 *puVar9;
  base_blob<256U> *pbVar10;
  pointer pCVar11;
  bool bVar12;
  _Rb_tree_color _Var13;
  unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *puVar14;
  CTxMemPoolEntry **ppCVar15;
  iterator iVar16;
  CAmount CVar17;
  long lVar18;
  char *pcVar19;
  iterator pvVar20;
  allocator_type *__a;
  iterator in_R9;
  iterator pvVar21;
  MiniMiner *__args_4;
  COutPoint *outpoint;
  pointer outpoint_00;
  bool *map;
  shared_ptr<const_CTransaction> *tx;
  pointer psVar22;
  long in_FS_OFFSET;
  initializer_list<COutPoint> __l;
  initializer_list<COutPoint> __l_00;
  initializer_list<COutPoint> __l_01;
  initializer_list<COutPoint> __l_02;
  initializer_list<COutPoint> __l_03;
  initializer_list<COutPoint> __l_04;
  initializer_list<COutPoint> __l_05;
  initializer_list<COutPoint> __l_06;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_07;
  initializer_list<COutPoint> __l_08;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  initializer_list<COutPoint> __l_09;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  initializer_list<COutPoint> __l_10;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  initializer_list<COutPoint> __l_11;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string file_47;
  initializer_list<transaction_identifier<false>_> __l_12;
  initializer_list<transaction_identifier<false>_> __l_13;
  initializer_list<transaction_identifier<false>_> __l_14;
  initializer_list<transaction_identifier<false>_> __l_15;
  initializer_list<transaction_identifier<false>_> __l_16;
  initializer_list<transaction_identifier<false>_> __l_17;
  initializer_list<transaction_identifier<false>_> __l_18;
  initializer_list<transaction_identifier<false>_> __l_19;
  const_string file_48;
  const_string file_49;
  const_string file_50;
  const_string file_51;
  const_string file_52;
  const_string file_53;
  const_string file_54;
  const_string file_55;
  const_string file_56;
  const_string file_57;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  const_string msg_48;
  const_string msg_49;
  const_string msg_50;
  const_string msg_51;
  const_string msg_52;
  const_string msg_53;
  const_string msg_54;
  const_string msg_55;
  const_string msg_56;
  const_string msg_57;
  optional<long> oVar23;
  check_type cVar24;
  undefined1 *local_1100;
  undefined1 *local_10f8;
  char *local_10f0;
  char *local_10e8;
  undefined1 *local_10e0;
  undefined1 *local_10d8;
  char *local_10d0;
  char *local_10c8;
  undefined1 *local_10c0;
  undefined1 *local_10b8;
  char *local_10b0;
  char *local_10a8;
  undefined1 *local_10a0;
  undefined1 *local_1098;
  char *local_1090;
  char *local_1088;
  undefined1 *local_1080;
  undefined1 *local_1078;
  char *local_1070;
  char *local_1068;
  undefined1 *local_1060;
  undefined1 *local_1058;
  char *local_1050;
  char *local_1048;
  undefined1 *local_1040;
  undefined1 *local_1038;
  char *local_1030;
  char *local_1028;
  undefined1 *local_1020;
  undefined1 *local_1018;
  char *local_1010;
  char *local_1008;
  char *local_1000;
  char *local_ff8;
  undefined1 *local_ff0;
  undefined1 *local_fe8;
  char *local_fe0;
  char *local_fd8;
  char *local_fd0;
  char *local_fc8;
  undefined1 *local_fc0;
  undefined1 *local_fb8;
  char *local_fb0;
  char *local_fa8;
  undefined1 *local_fa0;
  undefined1 *local_f98;
  char *local_f90;
  char *local_f88;
  char *local_f80;
  char *local_f78;
  undefined1 *local_f70;
  undefined1 *local_f68;
  char *local_f60;
  char *local_f58;
  undefined1 *local_f50;
  undefined1 *local_f48;
  char *local_f40;
  char *local_f38;
  char *local_f30;
  char *local_f28;
  undefined1 *local_f20;
  undefined1 *local_f18;
  char *local_f10;
  char *local_f08;
  char *local_f00;
  char *local_ef8;
  undefined1 *local_ef0;
  undefined1 *local_ee8;
  char *local_ee0;
  char *local_ed8;
  undefined1 *local_ed0;
  undefined1 *local_ec8;
  char *local_ec0;
  char *local_eb8;
  char *local_eb0;
  char *local_ea8;
  undefined1 *local_ea0;
  undefined1 *local_e98;
  char *local_e90;
  char *local_e88;
  char *local_e80;
  char *local_e78;
  undefined1 *local_e70;
  undefined1 *local_e68;
  char *local_e60;
  char *local_e58;
  char *local_e50;
  char *local_e48;
  undefined1 *local_e40;
  undefined1 *local_e38;
  char *local_e30;
  char *local_e28;
  undefined1 *local_e20;
  undefined1 *local_e18;
  char *local_e10;
  char *local_e08;
  char *local_e00;
  char *local_df8;
  undefined1 *local_df0;
  undefined1 *local_de8;
  char *local_de0;
  char *local_dd8;
  char *local_dd0;
  char *local_dc8;
  undefined1 *local_dc0;
  undefined1 *local_db8;
  char *local_db0;
  char *local_da8;
  char *local_da0;
  char *local_d98;
  undefined1 *local_d90;
  undefined1 *local_d88;
  char *local_d80;
  char *local_d78;
  undefined1 *local_d70;
  undefined1 *local_d68;
  char *local_d60;
  char *local_d58;
  char *local_d50;
  char *local_d48;
  undefined1 *local_d40;
  undefined1 *local_d38;
  char *local_d30;
  char *local_d28;
  undefined1 *local_d20;
  undefined1 *local_d18;
  char *local_d10;
  char *local_d08;
  char *local_d00;
  char *local_cf8;
  undefined1 *local_cf0;
  undefined1 *local_ce8;
  char *local_ce0;
  char *local_cd8;
  char *local_cd0;
  char *local_cc8;
  undefined1 *local_cc0;
  undefined1 *local_cb8;
  char *local_cb0;
  char *local_ca8;
  undefined1 *local_ca0;
  undefined1 *local_c98;
  char *local_c90;
  char *local_c88;
  char *local_c80;
  char *local_c78;
  undefined1 *local_c70;
  undefined1 *local_c68;
  char *local_c60;
  char *local_c58;
  char *local_c50;
  char *local_c48;
  undefined1 *local_c40;
  undefined1 *local_c38;
  char *local_c30;
  char *local_c28;
  undefined1 local_c20 [8];
  undefined1 local_c18 [16];
  shared_count sStack_c08;
  _Base_ptr local_c00;
  undefined1 *local_bf8;
  undefined1 *local_bf0;
  char *local_be8;
  char *local_be0;
  char *local_bd8;
  char *local_bd0;
  undefined1 *local_bc8;
  undefined1 *local_bc0;
  char *local_bb8;
  char *local_bb0;
  char *local_ba8;
  char *local_ba0;
  undefined1 *local_b98;
  undefined1 *local_b90;
  char *local_b88;
  char *local_b80;
  char *local_b78;
  char *local_b70;
  undefined1 *local_b68;
  undefined1 *local_b60;
  char *local_b58;
  char *local_b50;
  undefined1 *local_b48;
  undefined1 *local_b40;
  char *local_b38;
  char *local_b30;
  char *local_b28;
  char *local_b20;
  undefined1 *local_b18;
  undefined1 *local_b10;
  char *local_b08;
  char *local_b00;
  char *local_af8;
  char *local_af0;
  undefined1 *local_ae8;
  undefined1 *local_ae0;
  char *local_ad8;
  char *local_ad0;
  char *local_ac8;
  char *local_ac0;
  undefined1 *local_ab8;
  undefined1 *local_ab0;
  char *local_aa8;
  char *local_aa0;
  undefined1 *local_a98;
  undefined1 *local_a90;
  char *local_a88;
  char *local_a80;
  char *local_a78;
  char *local_a70;
  undefined1 *local_a68;
  undefined1 *local_a60;
  char *local_a58;
  char *local_a50;
  undefined1 *local_a48;
  undefined1 *local_a40;
  char *local_a38;
  char *local_a30;
  char *local_a28;
  char *local_a20;
  undefined1 *local_a18;
  undefined1 *local_a10;
  char *local_a08;
  char *local_a00;
  undefined1 *local_9f8;
  undefined1 *local_9f0;
  char *local_9e8;
  char *local_9e0;
  char *local_9d8;
  char *local_9d0;
  undefined1 *local_9c8;
  undefined1 *local_9c0;
  char *local_9b8;
  char *local_9b0;
  undefined1 *local_9a8;
  undefined1 *local_9a0;
  char *local_998;
  char *local_990;
  char *local_988;
  char *local_980;
  undefined1 *local_978;
  undefined1 *local_970;
  char *local_968;
  char *local_960;
  char *local_958;
  char *local_950;
  undefined1 *local_948;
  undefined1 *local_940;
  char *local_938;
  char *local_930;
  char *local_928;
  char *local_920;
  undefined1 *local_918;
  undefined1 *local_910;
  char *local_908;
  char *local_900;
  undefined1 *local_8f8;
  undefined1 *local_8f0;
  char *local_8e8;
  char *local_8e0;
  char *local_8d8;
  char *local_8d0;
  undefined1 *local_8c8;
  undefined1 *local_8c0;
  char *local_8b8;
  char *local_8b0;
  char *local_8a8;
  char *local_8a0;
  undefined1 *local_898;
  undefined1 *local_890;
  char *local_888;
  char *local_880;
  CFeeRate very_high_feerate;
  char *local_870;
  char *local_868;
  undefined1 *local_860;
  undefined1 *local_858;
  char *local_850;
  char *local_848;
  char *local_840;
  char *local_838;
  undefined1 *local_830;
  undefined1 *local_828;
  char *local_820;
  char *local_818;
  char *local_810;
  char *local_808;
  undefined1 *local_800;
  undefined1 *local_7f8;
  char *local_7f0;
  char *local_7e8;
  CFeeRate tx7_anc_feerate;
  char *local_7d8;
  char *local_7d0;
  undefined1 *local_7c8;
  undefined1 *local_7c0;
  char *local_7b8;
  char *local_7b0;
  CFeeRate tx6_anc_feerate;
  CFeeRate tx4_feerate;
  char *local_798;
  char *local_790;
  undefined1 *local_788;
  undefined1 *local_780;
  char *local_778;
  char *local_770;
  CFeeRate tx3_anc_feerate;
  char *local_760;
  char *local_758;
  undefined1 *local_750;
  undefined1 *local_748;
  char *local_740;
  char *local_738;
  CFeeRate tx3_feerate;
  CFeeRate tx2_feerate;
  char *local_720;
  char *local_718;
  undefined1 *local_710;
  undefined1 *local_708;
  char *local_700;
  char *local_6f8;
  vector<COutPoint,_std::allocator<COutPoint>_> all_unspent_outpoints;
  vector<long,_std::allocator<long>_> tx_vsizes;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  all_transactions;
  CTransactionRef tx7;
  CTransactionRef tx6;
  CTransactionRef tx5;
  CTransactionRef tx4;
  CTransactionRef tx3;
  CTransactionRef tx2;
  CTransactionRef tx1;
  CTransactionRef tx0;
  TestMemPoolEntryHelper entry;
  undefined1 local_5e0 [8];
  CFeeRate just_below_tx4;
  undefined1 local_5d0 [16];
  shared_count sStack_5c0;
  _Base_ptr local_5b8;
  undefined1 local_5b0 [16];
  shared_count sStack_5a0;
  vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> miniminer_info;
  optional<long> tx6_tx7_bumpfee;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  optional<long> tx3_bump_fee;
  map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
  descendant_caches;
  MiniMiner mini_miner_tx6_tx7;
  MiniMiner miniminer_pool;
  map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  bump_fees;
  MiniMiner miniminer_manual;
  
  local_1030 = (char *)0x0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar19 = "m_node.mempool";
  puVar14 = inline_assertion_check<true,std::unique_ptr<CTxMemPool,std::default_delete<CTxMemPool>>&>
                      (&(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
                        super_BasicTestingSetup.m_node.mempool,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
                       ,0x192,"test_method","m_node.mempool");
  this_00 = (puVar14->_M_t).super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t
            .super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  criticalblock1.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock1.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock1.super_unique_lock);
  criticalblock2.super_unique_lock._M_device = &(this_00->cs).super_recursive_mutex;
  criticalblock2.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock2.super_unique_lock);
  entry.nFee = 0;
  entry.time.__d.__r = (duration)0;
  entry.nHeight = 1;
  entry.m_sequence = 0;
  entry.spendsCoinbase = false;
  entry.sigOpCost = 4;
  entry.lp.height = 0;
  entry.lp.time = 0;
  entry.lp.maxInputBlock = (CBlockIndex *)0x0;
  peVar2 = (((this->super_TestChain100Setup).m_coinbase_txns.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  miniminer_manual._0_8_ = *(undefined8 *)&(peVar2->hash).m_wrapped;
  puVar4 = (uchar *)((long)&peVar2->hash + 8);
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = puVar4[0];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = puVar4[1];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = puVar4[2];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = puVar4[3];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = puVar4[4];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = puVar4[5];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = puVar4[6];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = puVar4[7];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)((long)&peVar2->hash + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)((long)&peVar2->hash + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  __l._M_len = 1;
  __l._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,__l,
             (allocator_type *)&mini_miner_tx6_tx7);
  make_tx((miniminer_tests *)&tx0,(vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,2
         );
  if (miniminer_pool._0_8_ != 0) {
    operator_delete((void *)miniminer_pool._0_8_,
                    miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header.
                    _0_8_ - miniminer_pool._0_8_);
  }
  entry.nFee = 500;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&miniminer_manual,&entry,&tx0);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&miniminer_manual);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header)
  ;
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
  if (miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_);
  }
  peVar2 = (this->super_TestChain100Setup).m_coinbase_txns.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  miniminer_manual._0_8_ = *(undefined8 *)&(peVar2->hash).m_wrapped;
  puVar4 = (uchar *)((long)&peVar2->hash + 8);
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = puVar4[0];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = puVar4[1];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = puVar4[2];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = puVar4[3];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = puVar4[4];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = puVar4[5];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = puVar4[6];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = puVar4[7];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)((long)&peVar2->hash + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)((long)&peVar2->hash + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,__l_00,
             (allocator_type *)&mini_miner_tx6_tx7);
  make_tx((miniminer_tests *)&tx1,(vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,2
         );
  if (miniminer_pool._0_8_ != 0) {
    operator_delete((void *)miniminer_pool._0_8_,
                    miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header.
                    _0_8_ - miniminer_pool._0_8_);
  }
  entry.nFee = 5000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&miniminer_manual,&entry,&tx1);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&miniminer_manual);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header)
  ;
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
  if (miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_);
  }
  peVar2 = (this->super_TestChain100Setup).m_coinbase_txns.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start[2].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  miniminer_manual._0_8_ = *(undefined8 *)&(peVar2->hash).m_wrapped;
  puVar4 = (uchar *)((long)&peVar2->hash + 8);
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = puVar4[0];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = puVar4[1];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = puVar4[2];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = puVar4[3];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = puVar4[4];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = puVar4[5];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = puVar4[6];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = puVar4[7];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)((long)&peVar2->hash + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)((long)&peVar2->hash + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,__l_01,
             (allocator_type *)&mini_miner_tx6_tx7);
  make_tx((miniminer_tests *)&tx2,(vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,2
         );
  if (miniminer_pool._0_8_ != 0) {
    operator_delete((void *)miniminer_pool._0_8_,
                    miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header.
                    _0_8_ - miniminer_pool._0_8_);
  }
  entry.nFee = 100000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&miniminer_manual,&entry,&tx2);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&miniminer_manual);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header)
  ;
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
  if (miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_);
  }
  puVar9 = &((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped;
  miniminer_manual.m_ready_to_calculate = (bool)(puVar9->super_base_blob<256U>).m_data._M_elems[0];
  miniminer_manual._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
  miniminer_manual._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
  miniminer_manual._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
  miniminer_manual._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
  miniminer_manual._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
  miniminer_manual._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
  miniminer_manual._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
  pbVar10 = &((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar10->m_data)._M_elems[8];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar10->m_data)._M_elems[9];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar10->m_data)._M_elems[10];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar10->m_data)._M_elems[0xb];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar10->m_data)._M_elems[0xc];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar10->m_data)._M_elems[0xd];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar10->m_data)._M_elems[0xe];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar10->m_data)._M_elems[0xf];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  uVar5 = *(undefined8 *)
           ((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
           m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar6 = *(undefined8 *)
           (((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uVar7 = *(undefined8 *)
           (((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  uVar8 = *(undefined8 *)
           (((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
       (undefined4)uVar5;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ =
       (undefined4)((ulong)uVar5 >> 0x20);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ =
       (undefined4)uVar6;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
       (undefined4)((ulong)uVar6 >> 0x20);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
       (undefined4)uVar7;
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = SUB84((ulong)uVar7 >> 0x20,0);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ = SUB84(uVar8,0);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = (_Rb_tree_color)((ulong)uVar8 >> 0x20);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header._4_4_
       = 0;
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = *(_Base_ptr *)
               ((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = *(_Base_ptr *)
             (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash
              ).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = *(_Base_ptr *)
              (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_node_count =
       *(size_t *)
        (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_inclusion_order._M_t._M_impl._0_4_ = 0;
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,__l_02,
             (allocator_type *)&mini_miner_tx6_tx7);
  make_tx((miniminer_tests *)&tx3,(vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,3
         );
  if (miniminer_pool._0_8_ != 0) {
    operator_delete((void *)miniminer_pool._0_8_,
                    miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header.
                    _0_8_ - miniminer_pool._0_8_);
  }
  entry.nFee = 100000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&miniminer_manual,&entry,&tx3);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&miniminer_manual);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header)
  ;
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
  if (miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_);
  }
  peVar2 = (this->super_TestChain100Setup).m_coinbase_txns.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start[3].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  miniminer_manual._0_8_ = *(undefined8 *)&(peVar2->hash).m_wrapped;
  puVar4 = (uchar *)((long)&peVar2->hash + 8);
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = puVar4[0];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = puVar4[1];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = puVar4[2];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = puVar4[3];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = puVar4[4];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = puVar4[5];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = puVar4[6];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = puVar4[7];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)((long)&peVar2->hash + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)((long)&peVar2->hash + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,__l_03,
             (allocator_type *)&mini_miner_tx6_tx7);
  make_tx((miniminer_tests *)&tx4,(vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,2
         );
  if (miniminer_pool._0_8_ != 0) {
    operator_delete((void *)miniminer_pool._0_8_,
                    miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header.
                    _0_8_ - miniminer_pool._0_8_);
  }
  entry.nFee = 100000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&miniminer_manual,&entry,&tx4);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&miniminer_manual);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header)
  ;
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
  if (miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_);
  }
  puVar9 = &((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped;
  miniminer_manual.m_ready_to_calculate = (bool)(puVar9->super_base_blob<256U>).m_data._M_elems[0];
  miniminer_manual._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
  miniminer_manual._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
  miniminer_manual._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
  miniminer_manual._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
  miniminer_manual._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
  miniminer_manual._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
  miniminer_manual._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
  pbVar10 = &((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar10->m_data)._M_elems[8];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar10->m_data)._M_elems[9];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar10->m_data)._M_elems[10];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar10->m_data)._M_elems[0xb];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar10->m_data)._M_elems[0xc];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar10->m_data)._M_elems[0xd];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar10->m_data)._M_elems[0xe];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar10->m_data)._M_elems[0xf];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,__l_04,
             (allocator_type *)&mini_miner_tx6_tx7);
  make_tx((miniminer_tests *)&tx5,(vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,3
         );
  if (miniminer_pool._0_8_ != 0) {
    operator_delete((void *)miniminer_pool._0_8_,
                    miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header.
                    _0_8_ - miniminer_pool._0_8_);
  }
  entry.nFee = 500;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&miniminer_manual,&entry,&tx5);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&miniminer_manual);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header)
  ;
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
  if (miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_);
  }
  puVar9 = &((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped;
  miniminer_manual.m_ready_to_calculate = (bool)(puVar9->super_base_blob<256U>).m_data._M_elems[0];
  miniminer_manual._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
  miniminer_manual._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
  miniminer_manual._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
  miniminer_manual._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
  miniminer_manual._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
  miniminer_manual._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
  miniminer_manual._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
  pbVar10 = &((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar10->m_data)._M_elems[8];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar10->m_data)._M_elems[9];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar10->m_data)._M_elems[10];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar10->m_data)._M_elems[0xb];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar10->m_data)._M_elems[0xc];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar10->m_data)._M_elems[0xd];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar10->m_data)._M_elems[0xe];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar10->m_data)._M_elems[0xf];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  __l_05._M_len = 1;
  __l_05._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,__l_05,
             (allocator_type *)&mini_miner_tx6_tx7);
  make_tx((miniminer_tests *)&tx6,(vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,2
         );
  if (miniminer_pool._0_8_ != 0) {
    operator_delete((void *)miniminer_pool._0_8_,
                    miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header.
                    _0_8_ - miniminer_pool._0_8_);
  }
  entry.nFee = 5000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&miniminer_manual,&entry,&tx6);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&miniminer_manual);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header)
  ;
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
  if (miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_);
  }
  puVar9 = &((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped;
  miniminer_manual.m_ready_to_calculate = (bool)(puVar9->super_base_blob<256U>).m_data._M_elems[0];
  miniminer_manual._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
  miniminer_manual._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
  miniminer_manual._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
  miniminer_manual._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
  miniminer_manual._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
  miniminer_manual._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
  miniminer_manual._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
  pbVar10 = &((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar10->m_data)._M_elems[8];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar10->m_data)._M_elems[9];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar10->m_data)._M_elems[10];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar10->m_data)._M_elems[0xb];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar10->m_data)._M_elems[0xc];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar10->m_data)._M_elems[0xd];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar10->m_data)._M_elems[0xe];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar10->m_data)._M_elems[0xf];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 1;
  __l_06._M_len = 1;
  __l_06._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,__l_06,
             (allocator_type *)&mini_miner_tx6_tx7);
  make_tx((miniminer_tests *)&tx7,(vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,2
         );
  if (miniminer_pool._0_8_ != 0) {
    operator_delete((void *)miniminer_pool._0_8_,
                    miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header.
                    _0_8_ - miniminer_pool._0_8_);
  }
  entry.nFee = 100000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&miniminer_manual,&entry,&tx7);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&miniminer_manual);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header)
  ;
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
  if (miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_);
  }
  miniminer_manual._0_8_ =
       tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ =
       tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ =
       SUB84(tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
       (undefined4)
       ((ulong)tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr >> 0x20
       );
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ =
       SUB84(tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi,0);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ =
       (undefined4)
       ((ulong)tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi >> 0x20);
  if (tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
       SUB84(tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
       (undefined4)
       ((ulong)tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr >> 0x20
       );
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ =
       SUB84(tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi,0);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ =
       SUB84((ulong)tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi >> 0x20,0);
  if (tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = (_Rb_tree_color)
             tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header._4_4_
       = SUB84((ulong)tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               >> 0x20,0);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)
              tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
  if (tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = (_Base_ptr)tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = (_Base_ptr)
             tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
  if (tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  miniminer_manual.m_inclusion_order._M_t._M_impl._0_4_ =
       SUB84(tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi,0);
  miniminer_manual.m_inclusion_order._M_t._M_impl._4_4_ =
       SUB84((ulong)tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi >> 0x20,0);
  if (tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       (_Rb_tree_color)tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
       SUB84((ulong)tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr >>
             0x20,0);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ =
       SUB84(tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi,0);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ =
       (undefined4)
       ((ulong)tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi >> 0x20);
  if (tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  __l_07._M_len = 8;
  __l_07._M_array = (iterator)&miniminer_manual;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&all_transactions,__l_07,(allocator_type *)&miniminer_pool);
  lVar18 = 0x80;
  do {
    this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)&bump_fees._M_t._M_impl.super__Rb_tree_header._M_node_count + lVar18);
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    lVar18 = lVar18 + -0x10;
  } while (lVar18 != 0);
  tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<long,_std::allocator<long>_>::reserve
            (&tx_vsizes,
             (long)all_transactions.
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)all_transactions.
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  if (all_transactions.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      all_transactions.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar22 = all_transactions.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      miniminer_manual._0_8_ =
           GetVirtualTransactionSize
                     ((psVar22->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr,0,0);
      if (tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (&tx_vsizes,
                   (iterator)
                   tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(long *)&miniminer_manual);
      }
      else {
        *tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_finish = miniminer_manual._0_8_;
        tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      psVar22 = psVar22 + 1;
    } while (psVar22 !=
             all_transactions.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  puVar9 = &((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped;
  miniminer_manual.m_ready_to_calculate = (bool)(puVar9->super_base_blob<256U>).m_data._M_elems[0];
  miniminer_manual._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
  miniminer_manual._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
  miniminer_manual._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
  miniminer_manual._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
  miniminer_manual._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
  miniminer_manual._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
  miniminer_manual._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
  pbVar10 = &((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar10->m_data)._M_elems[8];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar10->m_data)._M_elems[9];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar10->m_data)._M_elems[10];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar10->m_data)._M_elems[0xb];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar10->m_data)._M_elems[0xc];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar10->m_data)._M_elems[0xd];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar10->m_data)._M_elems[0xe];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar10->m_data)._M_elems[0xf];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 1;
  uVar5 = *(undefined8 *)
           ((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
           m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar6 = *(undefined8 *)
           (((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uVar7 = *(undefined8 *)
           (((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  uVar8 = *(undefined8 *)
           (((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
       (undefined4)uVar5;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ =
       (undefined4)((ulong)uVar5 >> 0x20);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ =
       (undefined4)uVar6;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
       (undefined4)((ulong)uVar6 >> 0x20);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
       (undefined4)uVar7;
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = SUB84((ulong)uVar7 >> 0x20,0);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ = SUB84(uVar8,0);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = (_Rb_tree_color)((ulong)uVar8 >> 0x20);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header._4_4_
       = 1;
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = *(_Base_ptr *)
               ((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = *(_Base_ptr *)
             (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash
              ).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = *(_Base_ptr *)
              (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_node_count =
       *(size_t *)
        (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_inclusion_order._M_t._M_impl._0_4_ = 1;
  uVar5 = *(undefined8 *)
           ((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
           m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar6 = *(undefined8 *)
           (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uVar7 = *(undefined8 *)
           (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._20_8_ =
       *(undefined8 *)
        (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ =
       (undefined4)uVar7;
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ =
       (undefined4)((ulong)uVar7 >> 0x20);
  miniminer_manual.m_inclusion_order._M_t._M_impl._4_4_ = SUB84(uVar5,0);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       (_Rb_tree_color)((ulong)uVar5 >> 0x20);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
       SUB84(uVar6,0);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ =
       (undefined4)((ulong)uVar6 >> 0x20);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ = 0
  ;
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_node_count =
       *(size_t *)
        ((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
        m_wrapped.super_base_blob<256U>.m_data._M_elems;
  pbVar10 = &((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual.m_bump_fees._M_t._M_impl._0_1_ = (pbVar10->m_data)._M_elems[8];
  miniminer_manual.m_bump_fees._M_t._M_impl._1_1_ = (pbVar10->m_data)._M_elems[9];
  miniminer_manual.m_bump_fees._M_t._M_impl._2_1_ = (pbVar10->m_data)._M_elems[10];
  miniminer_manual.m_bump_fees._M_t._M_impl._3_1_ = (pbVar10->m_data)._M_elems[0xb];
  miniminer_manual.m_bump_fees._M_t._M_impl._4_1_ = (pbVar10->m_data)._M_elems[0xc];
  miniminer_manual.m_bump_fees._M_t._M_impl._5_1_ = (pbVar10->m_data)._M_elems[0xd];
  miniminer_manual.m_bump_fees._M_t._M_impl._6_1_ = (pbVar10->m_data)._M_elems[0xe];
  miniminer_manual.m_bump_fees._M_t._M_impl._7_1_ = (pbVar10->m_data)._M_elems[0xf];
  miniminer_manual.m_bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 1;
  miniminer_manual.m_bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._20_8_ =
       *(undefined8 *)
        ((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
        m_wrapped.super_base_blob<256U>.m_data._M_elems;
  miniminer_manual.m_bump_fees._M_t._M_impl.super__Rb_tree_header._28_8_ =
       *(undefined8 *)
        (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_manual._196_8_ =
       *(undefined8 *)
        (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_in_block._M_t._M_impl._4_8_ =
       *(undefined8 *)
        (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_in_block._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 2;
  miniminer_manual.m_in_block._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        ((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
        m_wrapped.super_base_blob<256U>.m_data._M_elems;
  miniminer_manual.m_in_block._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       *(_Base_ptr *)
        (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_manual.m_in_block._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       *(_Base_ptr *)
        (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_in_block._M_t._M_impl.super__Rb_tree_header._M_node_count =
       *(size_t *)
        (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_total_fees._0_4_ = 1;
  miniminer_manual._252_8_ =
       *(undefined8 *)
        ((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
        m_wrapped.super_base_blob<256U>.m_data._M_elems;
  pbVar10 = &((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual._260_1_ = (pbVar10->m_data)._M_elems[8];
  miniminer_manual._261_1_ = (pbVar10->m_data)._M_elems[9];
  miniminer_manual._262_1_ = (pbVar10->m_data)._M_elems[10];
  miniminer_manual._263_1_ = (pbVar10->m_data)._M_elems[0xb];
  miniminer_manual.m_entries_by_txid._M_t._M_impl._0_1_ = (pbVar10->m_data)._M_elems[0xc];
  miniminer_manual.m_entries_by_txid._M_t._M_impl._1_1_ = (pbVar10->m_data)._M_elems[0xd];
  miniminer_manual.m_entries_by_txid._M_t._M_impl._2_1_ = (pbVar10->m_data)._M_elems[0xe];
  miniminer_manual.m_entries_by_txid._M_t._M_impl._3_1_ = (pbVar10->m_data)._M_elems[0xf];
  miniminer_manual.m_entries_by_txid._M_t._M_impl._4_8_ =
       *(undefined8 *)
        (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_entries_by_txid._M_t._M_impl.super__Rb_tree_header._M_header._4_8_ =
       *(undefined8 *)
        (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_entries_by_txid._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ =
       2;
  miniminer_manual.m_entries_by_txid._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       *(_Base_ptr *)
        ((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
        m_wrapped.super_base_blob<256U>.m_data._M_elems;
  miniminer_manual.m_entries_by_txid._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       *(_Base_ptr *)
        (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_manual.m_entries_by_txid._M_t._M_impl.super__Rb_tree_header._M_node_count =
       *(size_t *)
        (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_entries.
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       *(pointer *)
        (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_entries.
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  uVar5 = *(undefined8 *)
           ((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
           m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar6 = *(undefined8 *)
           (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_manual.m_descendant_set_by_txid._M_t._M_impl._4_8_ =
       *(undefined8 *)
        (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_descendant_set_by_txid._M_t._M_impl.super__Rb_tree_header._M_header._4_8_ =
       *(undefined8 *)
        (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_entries.
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = (undefined4)uVar5;
  miniminer_manual.m_entries.
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)((ulong)uVar5 >> 0x20);
  miniminer_manual.m_entries.
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)uVar6;
  miniminer_manual.m_descendant_set_by_txid._M_t._M_impl._0_4_ = SUB84((ulong)uVar6 >> 0x20,0);
  miniminer_manual.m_descendant_set_by_txid._M_t._M_impl.super__Rb_tree_header._M_header._M_parent.
  _4_4_ = 0;
  __l_08._M_len = 10;
  __l_08._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            (&all_unspent_outpoints,__l_08,(allocator_type *)&miniminer_pool);
  pCVar11 = all_unspent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (all_unspent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
      super__Vector_impl_data._M_start !=
      all_unspent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    outpoint_00 = all_unspent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    do {
      local_700 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_6f8 = "";
      local_710 = &boost::unit_test::basic_cstring<char_const>::null;
      local_708 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0x1bb;
      file.m_begin = (iterator)&local_700;
      msg.m_end = in_R9;
      msg.m_begin = pcVar19;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_710,msg)
      ;
      _cVar24 = 0x46289f;
      bVar12 = CTxMemPool::isSpent(this_00,outpoint_00);
      miniminer_pool.m_ready_to_calculate = !bVar12;
      miniminer_pool.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
      mini_miner_tx6_tx7._0_8_ = anon_var_dwarf_d3a361;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ = "";
      miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ =
           miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
      miniminer_manual._0_8_ = &PTR__lazy_ostream_013abc70;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           boost::unit_test::lazy_ostream::inst;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&mini_miner_tx6_tx7;
      local_720 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_718 = "";
      pcVar19 = (char *)0x1;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&miniminer_pool,(lazy_ostream *)&miniminer_manual,1,0,WARN,
                 _cVar24,(size_t)&local_720,0x1bb);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header
                );
      outpoint_00 = outpoint_00 + 1;
    } while (outpoint_00 != pCVar11);
  }
  CFeeRate::CFeeRate(&tx2_feerate,&high_fee,
                     *(uint32_t *)
                      (tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start + 2));
  CFeeRate::CFeeRate(&tx3_feerate,&high_fee,
                     *(uint32_t *)
                      (tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start + 3));
  local_740 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_738 = "";
  local_750 = &boost::unit_test::basic_cstring<char_const>::null;
  local_748 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar24 = 0x4629f0;
  file_00.m_end = (iterator)0x1c0;
  file_00.m_begin = (iterator)&local_740;
  msg_00.m_end = in_R9;
  msg_00.m_begin = pcVar19;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_750,
             msg_00);
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
  mini_miner_tx6_tx7._0_8_ = anon_var_dwarf_d3a641;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ = (long)"tx2_feerate > tx3_feerate" + 0x19;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
  miniminer_manual._0_8_ = &PTR__lazy_ostream_013abc70;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&mini_miner_tx6_tx7;
  local_760 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_758 = "";
  pvVar20 = (iterator)0x0;
  miniminer_pool.m_ready_to_calculate = tx3_feerate.nSatoshisPerK < tx2_feerate.nSatoshisPerK;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&miniminer_pool,(lazy_ostream *)&miniminer_manual,1,0,WARN,_cVar24,
             (size_t)&local_760,0x1c0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
  miniminer_manual.m_ready_to_calculate = true;
  miniminer_manual._1_7_ = 0x322;
  CFeeRate::CFeeRate(&tx3_anc_feerate,(CAmount *)&miniminer_manual,
                     (int)(tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start[3] +
                          tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start[1]) +
                     (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start[2] +
                     (int)*tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start);
  miniminer_manual._0_8_ =
       CTxMemPool::GetEntry
                 (this_00,&(tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->hash);
  pcVar19 = "pool.GetEntry(tx3->GetHash())";
  ppCVar15 = inline_assertion_check<true,CTxMemPoolEntry_const*>
                       ((CTxMemPoolEntry **)&miniminer_manual,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
                        ,0x1c2,"test_method","pool.GetEntry(tx3->GetHash())");
  pCVar3 = *ppCVar15;
  local_778 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_770 = "";
  local_788 = &boost::unit_test::basic_cstring<char_const>::null;
  local_780 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x1c3;
  file_01.m_begin = (iterator)&local_778;
  msg_01.m_end = pvVar20;
  msg_01.m_begin = pcVar19;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_788,
             msg_01);
  bump_fees._M_t._M_impl._0_8_ = pCVar3->nModFeesWithAncestors;
  _cVar24 = 0x462b7f;
  CFeeRate::CFeeRate((CFeeRate *)&descendant_caches,(CAmount *)&bump_fees,
                     (uint32_t)pCVar3->nSizeWithAncestors);
  miniminer_pool.m_ready_to_calculate =
       tx3_anc_feerate.nSatoshisPerK == descendant_caches._M_t._M_impl._0_8_;
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
  mini_miner_tx6_tx7._0_8_ = anon_var_dwarf_d3a667;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
       (long)
       "tx3_anc_feerate == CFeeRate(tx3_entry.GetModFeesWithAncestors(), tx3_entry.GetSizeWithAncestors())"
       + 0x62;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
  miniminer_manual._0_8_ = &PTR__lazy_ostream_013abc70;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&mini_miner_tx6_tx7;
  local_798 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_790 = "";
  pvVar20 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&miniminer_pool,(lazy_ostream *)&miniminer_manual,1,0,WARN,_cVar24,
             (size_t)&local_798,0x1c3);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
  CFeeRate::CFeeRate(&tx4_feerate,&high_fee,
                     *(uint32_t *)
                      (tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start + 4));
  miniminer_manual.m_ready_to_calculate = true;
  miniminer_manual._1_7_ = 0x19c;
  CFeeRate::CFeeRate(&tx6_anc_feerate,(CAmount *)&miniminer_manual,
                     (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start[5] +
                     (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start[4] +
                     (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start[6]);
  miniminer_manual._0_8_ =
       CTxMemPool::GetEntry
                 (this_00,&(tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->hash);
  pcVar19 = "pool.GetEntry(tx6->GetHash())";
  ppCVar15 = inline_assertion_check<true,CTxMemPoolEntry_const*>
                       ((CTxMemPoolEntry **)&miniminer_manual,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
                        ,0x1c6,"test_method","pool.GetEntry(tx6->GetHash())");
  pCVar3 = *ppCVar15;
  local_7b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_7b0 = "";
  local_7c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x1c7;
  file_02.m_begin = (iterator)&local_7b8;
  msg_02.m_end = pvVar20;
  msg_02.m_begin = pcVar19;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_7c8,
             msg_02);
  bump_fees._M_t._M_impl._0_8_ = pCVar3->nModFeesWithAncestors;
  _cVar24 = 0x462d1c;
  CFeeRate::CFeeRate((CFeeRate *)&descendant_caches,(CAmount *)&bump_fees,
                     (uint32_t)pCVar3->nSizeWithAncestors);
  miniminer_pool.m_ready_to_calculate =
       tx6_anc_feerate.nSatoshisPerK == descendant_caches._M_t._M_impl._0_8_;
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
  mini_miner_tx6_tx7._0_8_ = anon_var_dwarf_d3a68d;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
       (long)
       "tx6_anc_feerate == CFeeRate(tx6_entry.GetModFeesWithAncestors(), tx6_entry.GetSizeWithAncestors())"
       + 0x62;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
  miniminer_manual._0_8_ = &PTR__lazy_ostream_013abc70;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&mini_miner_tx6_tx7;
  local_7d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_7d0 = "";
  pvVar20 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&miniminer_pool,(lazy_ostream *)&miniminer_manual,1,0,WARN,_cVar24,
             (size_t)&local_7d8,0x1c7);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
  miniminer_manual.m_ready_to_calculate = true;
  miniminer_manual._1_7_ = 0x30f;
  CFeeRate::CFeeRate(&tx7_anc_feerate,(CAmount *)&miniminer_manual,
                     (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start[5] +
                     (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start[4] +
                     (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start[7]);
  miniminer_manual._0_8_ =
       CTxMemPool::GetEntry
                 (this_00,&(tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->hash);
  pcVar19 = "pool.GetEntry(tx7->GetHash())";
  ppCVar15 = inline_assertion_check<true,CTxMemPoolEntry_const*>
                       ((CTxMemPoolEntry **)&miniminer_manual,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
                        ,0x1c9,"test_method","pool.GetEntry(tx7->GetHash())");
  pCVar3 = *ppCVar15;
  local_7f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_7e8 = "";
  local_800 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x1ca;
  file_03.m_begin = (iterator)&local_7f0;
  msg_03.m_end = pvVar20;
  msg_03.m_begin = pcVar19;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_800,
             msg_03);
  bump_fees._M_t._M_impl._0_8_ = pCVar3->nModFeesWithAncestors;
  _cVar24 = 0x462e95;
  CFeeRate::CFeeRate((CFeeRate *)&descendant_caches,(CAmount *)&bump_fees,
                     (uint32_t)pCVar3->nSizeWithAncestors);
  miniminer_pool.m_ready_to_calculate =
       tx7_anc_feerate.nSatoshisPerK == descendant_caches._M_t._M_impl._0_8_;
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
  mini_miner_tx6_tx7._0_8_ = anon_var_dwarf_d3a6a5;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
       (long)
       "tx7_anc_feerate == CFeeRate(tx7_entry.GetModFeesWithAncestors(), tx7_entry.GetSizeWithAncestors())"
       + 0x62;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
  miniminer_manual._0_8_ = &PTR__lazy_ostream_013abc70;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&mini_miner_tx6_tx7;
  local_810 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_808 = "";
  pvVar20 = (iterator)0x1;
  pvVar21 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&miniminer_pool,(lazy_ostream *)&miniminer_manual,1,0,WARN,_cVar24,
             (size_t)&local_810,0x1ca);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
  local_820 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_818 = "";
  local_830 = &boost::unit_test::basic_cstring<char_const>::null;
  local_828 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar24 = 0x462f75;
  file_04.m_end = (iterator)0x1cb;
  file_04.m_begin = (iterator)&local_820;
  msg_04.m_end = pvVar21;
  msg_04.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_830,
             msg_04);
  miniminer_pool.m_ready_to_calculate = tx6_anc_feerate.nSatoshisPerK < tx4_feerate.nSatoshisPerK;
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
  mini_miner_tx6_tx7._0_8_ = anon_var_dwarf_d3a6b1;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
       (long)"tx4_feerate > tx6_anc_feerate" + 0x1d;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
  miniminer_manual._0_8_ = &PTR__lazy_ostream_013abc70;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&mini_miner_tx6_tx7;
  local_840 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_838 = "";
  pvVar20 = (iterator)0x1;
  pvVar21 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&miniminer_pool,(lazy_ostream *)&miniminer_manual,1,0,WARN,_cVar24,
             (size_t)&local_840,0x1cb);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
  local_850 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_848 = "";
  local_860 = &boost::unit_test::basic_cstring<char_const>::null;
  local_858 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar24 = 0x46304e;
  file_05.m_end = (iterator)0x1cc;
  file_05.m_begin = (iterator)&local_850;
  msg_05.m_end = pvVar21;
  msg_05.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_860,
             msg_05);
  miniminer_pool.m_ready_to_calculate = tx7_anc_feerate.nSatoshisPerK < tx4_feerate.nSatoshisPerK;
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
  mini_miner_tx6_tx7._0_8_ = anon_var_dwarf_d3a6bd;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ = "";
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
  miniminer_manual._0_8_ = &PTR__lazy_ostream_013abc70;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&mini_miner_tx6_tx7;
  local_870 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_868 = "";
  pvVar20 = (iterator)0x1;
  pvVar21 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&miniminer_pool,(lazy_ostream *)&miniminer_manual,1,0,WARN,_cVar24,
             (size_t)&local_870,0x1cc);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
  ::node::MiniMiner::MiniMiner(&miniminer_manual,this_00,&all_unspent_outpoints);
  very_high_feerate.nSatoshisPerK = 100000000;
  local_888 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_880 = "";
  local_898 = &boost::unit_test::basic_cstring<char_const>::null;
  local_890 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar24 = 0x463152;
  file_06.m_end = (iterator)0x1d2;
  file_06.m_begin = (iterator)&local_888;
  msg_06.m_end = pvVar21;
  msg_06.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_898,
             msg_06);
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
  descendant_caches._M_t._M_impl._0_8_ = anon_var_dwarf_d3a6d7;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (long)"tx3_anc_feerate < very_high_feerate" + 0x23;
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  miniminer_pool._0_8_ = &PTR__lazy_ostream_013abc70;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_8a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_8a0 = "";
  pvVar20 = (iterator)0x1;
  pvVar21 = (iterator)0x0;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&descendant_caches;
  mini_miner_tx6_tx7.m_ready_to_calculate =
       tx3_anc_feerate.nSatoshisPerK < very_high_feerate.nSatoshisPerK;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&mini_miner_tx6_tx7,(lazy_ostream *)&miniminer_pool,1,0,WARN,
             _cVar24,(size_t)&local_8a8,0x1d2);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header
            );
  local_8b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_8b0 = "";
  local_8c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8c0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar24 = 0x463223;
  file_07.m_end = (iterator)0x1d3;
  file_07.m_begin = (iterator)&local_8b8;
  msg_07.m_end = pvVar21;
  msg_07.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_8c8,
             msg_07);
  mini_miner_tx6_tx7.m_ready_to_calculate = miniminer_manual.m_ready_to_calculate;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
  descendant_caches._M_t._M_impl._0_8_ = (long)"!mini_miner.IsReadyToCalculate()" + 1;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = "";
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  miniminer_pool._0_8_ = &PTR__lazy_ostream_013abc70;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_8d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_8d0 = "";
  pvVar20 = (iterator)0x1;
  pvVar21 = (iterator)0x0;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&descendant_caches;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&mini_miner_tx6_tx7,(lazy_ostream *)&miniminer_pool,1,0,WARN,
             _cVar24,(size_t)&local_8d8,0x1d3);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header
            );
  ::node::MiniMiner::CalculateBumpFees(&bump_fees,&miniminer_manual,&very_high_feerate);
  local_8e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_8e0 = "";
  local_8f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x1d5;
  file_08.m_begin = (iterator)&local_8e8;
  msg_08.m_end = pvVar21;
  msg_08.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_8f8,
             msg_08);
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
  descendant_caches._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abb30;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf6cf21;
  local_5b0._0_8_ = &tx3_bump_fee;
  tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload._M_value = bump_fees._M_t._M_impl.super__Rb_tree_header._M_node_count;
  tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload._M_value =
       ((long)all_unspent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)all_unspent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
              _M_impl.super__Vector_impl_data._M_start >> 2) * -0x71c71c71c71c71c7;
  miniminer_info.
  super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&tx6_tx7_bumpfee;
  local_5d0._8_8_ = (element_type *)0x0;
  sStack_5c0.pi_ = (sp_counted_base *)0x0;
  local_c18._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_c18._8_8_ = "";
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)local_5b0;
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  miniminer_pool._0_8_ = &PTR__lazy_ostream_013abb70;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&miniminer_info;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
       mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_013abb70;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  pvVar20 = (iterator)0x1;
  pvVar21 = (iterator)0x2;
  local_5d0[0] = (class_property<bool>)
                 (class_property<bool>)
                 (bump_fees._M_t._M_impl.super__Rb_tree_header._M_node_count ==
                 tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
                 super__Optional_payload_base<long>._M_payload._M_value);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_5d0,(lazy_ostream *)&descendant_caches,1,2,REQUIRE,0xea3b63,
             (size_t)local_c18,0x1d5,&miniminer_pool,"all_unspent_outpoints.size()",
             &mini_miner_tx6_tx7);
  boost::detail::shared_count::~shared_count(&sStack_5c0);
  local_908 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_900 = "";
  local_918 = &boost::unit_test::basic_cstring<char_const>::null;
  local_910 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar24 = 0x46347a;
  file_09.m_end = (iterator)0x1d6;
  file_09.m_begin = (iterator)&local_908;
  msg_09.m_end = pvVar21;
  msg_09.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_918,
             msg_09);
  mini_miner_tx6_tx7._0_8_ =
       CONCAT71(mini_miner_tx6_tx7._1_7_,miniminer_manual.m_ready_to_calculate) ^ 1;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
  descendant_caches._M_t._M_impl._0_8_ = anon_var_dwarf_d3a3c4;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (long)"!mini_miner.IsReadyToCalculate()" + 0x20;
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  miniminer_pool._0_8_ = &PTR__lazy_ostream_013abc70;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_928 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_920 = "";
  pvVar20 = (iterator)0x1;
  pvVar21 = (iterator)0x0;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&descendant_caches;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&mini_miner_tx6_tx7,(lazy_ostream *)&miniminer_pool,1,0,WARN,
             _cVar24,(size_t)&local_928,0x1d6);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header
            );
  local_938 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_930 = "";
  local_948 = &boost::unit_test::basic_cstring<char_const>::null;
  local_940 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x1d7;
  file_10.m_begin = (iterator)&local_938;
  msg_10.m_end = pvVar21;
  msg_10.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_948,
             msg_10);
  _cVar24 = 0x463558;
  bVar12 = sanity_check(&all_transactions,&bump_fees);
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
  descendant_caches._M_t._M_impl._0_8_ = anon_var_dwarf_d3a3dd;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (long)"sanity_check(all_transactions, bump_fees)" + 0x29;
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  miniminer_pool._0_8_ = &PTR__lazy_ostream_013abc70;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_958 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_950 = "";
  pvVar20 = (iterator)0x1;
  pvVar21 = (iterator)0x0;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&descendant_caches;
  mini_miner_tx6_tx7.m_ready_to_calculate = bVar12;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&mini_miner_tx6_tx7,(lazy_ostream *)&miniminer_pool,1,0,WARN,
             _cVar24,(size_t)&local_958,0x1d7);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header
            );
  puVar9 = &((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped;
  miniminer_pool.m_ready_to_calculate = (bool)(puVar9->super_base_blob<256U>).m_data._M_elems[0];
  miniminer_pool._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
  miniminer_pool._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
  miniminer_pool._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
  miniminer_pool._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
  miniminer_pool._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
  miniminer_pool._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
  miniminer_pool._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_16_ =
       *(undefined1 (*) [16])
        (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 1;
  iVar16 = std::
           _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
           ::find(&bump_fees._M_t,(key_type *)&miniminer_pool);
  local_968 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_960 = "";
  local_978 = &boost::unit_test::basic_cstring<char_const>::null;
  local_970 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar24 = 0x463660;
  file_11.m_end = (iterator)0x1d9;
  file_11.m_begin = (iterator)&local_968;
  msg_11.m_end = pvVar21;
  msg_11.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_978,
             msg_11);
  mini_miner_tx6_tx7.m_ready_to_calculate =
       (_Rb_tree_header *)iVar16._M_node != &bump_fees._M_t._M_impl.super__Rb_tree_header;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
  descendant_caches._M_t._M_impl._0_8_ = anon_var_dwarf_d3a6e3;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = "";
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  miniminer_pool._0_8_ = &PTR__lazy_ostream_013abc70;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_988 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_980 = "";
  pvVar20 = (iterator)0x1;
  pvVar21 = (iterator)0x0;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&descendant_caches;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&mini_miner_tx6_tx7,(lazy_ostream *)&miniminer_pool,1,0,WARN,
             _cVar24,(size_t)&local_988,0x1d9);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header
            );
  local_998 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_990 = "";
  local_9a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x1da;
  file_12.m_begin = (iterator)&local_998;
  msg_12.m_end = pvVar21;
  msg_12.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_9a8,
             msg_12);
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
  descendant_caches._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abb30;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf6cf21;
  CVar17 = CFeeRate::GetFee(&very_high_feerate,
                            (uint32_t)
                            *tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_start);
  local_5b0._0_8_ = &iVar16._M_node[2]._M_parent;
  tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload._M_value = CVar17 + -500;
  local_5d0[0] = (class_property<bool>)
                 (iVar16._M_node[2]._M_parent ==
                 (_Base_ptr)
                 tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
                 super__Optional_payload_base<long>._M_payload._M_value);
  local_5d0._8_8_ = (element_type *)0x0;
  sStack_5c0.pi_ = (sp_counted_base *)0x0;
  local_c18._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_c18._8_8_ = "";
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  miniminer_pool._0_8_ = &PTR__lazy_ostream_013abed0;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)local_5b0;
  miniminer_info.
  super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&tx3_bump_fee;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
       mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_013abed0;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&miniminer_info;
  pvVar20 = (iterator)0x1;
  pvVar21 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_5d0,(lazy_ostream *)&descendant_caches,1,2,REQUIRE,0xea40d6,
             (size_t)local_c18,0x1da,&miniminer_pool,
             "very_high_feerate.GetFee(tx_vsizes[0]) - low_fee",&mini_miner_tx6_tx7);
  boost::detail::shared_count::~shared_count(&sStack_5c0);
  puVar9 = &((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped;
  miniminer_pool.m_ready_to_calculate = (bool)(puVar9->super_base_blob<256U>).m_data._M_elems[0];
  miniminer_pool._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
  miniminer_pool._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
  miniminer_pool._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
  miniminer_pool._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
  miniminer_pool._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
  miniminer_pool._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
  miniminer_pool._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_16_ =
       *(undefined1 (*) [16])
        (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  iVar16 = std::
           _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
           ::find(&bump_fees._M_t,(key_type *)&miniminer_pool);
  local_9b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_9b0 = "";
  local_9c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9c0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar24 = 0x46390f;
  file_13.m_end = (iterator)0x1dc;
  file_13.m_begin = (iterator)&local_9b8;
  msg_13.m_end = pvVar21;
  msg_13.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_9c8,
             msg_13);
  mini_miner_tx6_tx7.m_ready_to_calculate =
       (_Rb_tree_header *)iVar16._M_node != &bump_fees._M_t._M_impl.super__Rb_tree_header;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
  descendant_caches._M_t._M_impl._0_8_ = anon_var_dwarf_d3a723;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = "";
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  miniminer_pool._0_8_ = &PTR__lazy_ostream_013abc70;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_9d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_9d0 = "";
  pvVar20 = (iterator)0x1;
  pvVar21 = (iterator)0x0;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&descendant_caches;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&mini_miner_tx6_tx7,(lazy_ostream *)&miniminer_pool,1,0,WARN,
             _cVar24,(size_t)&local_9d8,0x1dc);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header
            );
  local_9e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_9e0 = "";
  local_9f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x1de;
  file_14.m_begin = (iterator)&local_9e8;
  msg_14.m_end = pvVar21;
  msg_14.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_9f8,
             msg_14);
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
  descendant_caches._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abb30;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf6cf21;
  CVar17 = CFeeRate::GetFee(&very_high_feerate,
                            (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_start[1] +
                            (int)*tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                  super__Vector_impl_data._M_start +
                            (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_start[2] +
                            (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_start[3]);
  local_5b0._0_8_ = &iVar16._M_node[2]._M_parent;
  tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload._M_value = CVar17 + -0x322bc;
  local_5d0[0] = (class_property<bool>)
                 (iVar16._M_node[2]._M_parent ==
                 (_Base_ptr)
                 tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
                 super__Optional_payload_base<long>._M_payload._M_value);
  local_5d0._8_8_ = (element_type *)0x0;
  sStack_5c0.pi_ = (sp_counted_base *)0x0;
  local_c18._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_c18._8_8_ = "";
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  miniminer_pool._0_8_ = &PTR__lazy_ostream_013abed0;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)local_5b0;
  miniminer_info.
  super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&tx3_bump_fee;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
       mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_013abed0;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&miniminer_info;
  pvVar20 = (iterator)0x1;
  pvVar21 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_5d0,(lazy_ostream *)&descendant_caches,1,2,REQUIRE,0xea413a,
             (size_t)local_c18,0x1de,&miniminer_pool,
             "very_high_feerate.GetFee(tx_vsizes[0] + tx_vsizes[1] + tx_vsizes[2] + tx_vsizes[3]) - (low_fee + med_fee + high_fee + high_fee)"
             ,&mini_miner_tx6_tx7);
  boost::detail::shared_count::~shared_count(&sStack_5c0);
  puVar9 = &((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped;
  miniminer_pool.m_ready_to_calculate = (bool)(puVar9->super_base_blob<256U>).m_data._M_elems[0];
  miniminer_pool._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
  miniminer_pool._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
  miniminer_pool._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
  miniminer_pool._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
  miniminer_pool._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
  miniminer_pool._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
  miniminer_pool._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_16_ =
       *(undefined1 (*) [16])
        (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  iVar16 = std::
           _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
           ::find(&bump_fees._M_t,(key_type *)&miniminer_pool);
  local_a08 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_a00 = "";
  local_a18 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a10 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar24 = 0x463bce;
  file_15.m_end = (iterator)0x1e0;
  file_15.m_begin = (iterator)&local_a08;
  msg_15.m_end = pvVar21;
  msg_15.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_a18,
             msg_15);
  mini_miner_tx6_tx7.m_ready_to_calculate =
       (_Rb_tree_header *)iVar16._M_node != &bump_fees._M_t._M_impl.super__Rb_tree_header;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
  descendant_caches._M_t._M_impl._0_8_ = anon_var_dwarf_d3a755;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = "";
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  miniminer_pool._0_8_ = &PTR__lazy_ostream_013abc70;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_a28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_a20 = "";
  pvVar20 = (iterator)0x1;
  pvVar21 = (iterator)0x0;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&descendant_caches;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&mini_miner_tx6_tx7,(lazy_ostream *)&miniminer_pool,1,0,WARN,
             _cVar24,(size_t)&local_a28,0x1e0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header
            );
  local_a38 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_a30 = "";
  local_a48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a40 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x1e2;
  file_16.m_begin = (iterator)&local_a38;
  msg_16.m_end = pvVar21;
  msg_16.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_a48,
             msg_16);
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
  descendant_caches._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abb30;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf6cf21;
  CVar17 = CFeeRate::GetFee(&very_high_feerate,
                            (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_start[5] +
                            (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_start[4] +
                            (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_start[6]);
  local_5b0._0_8_ = &iVar16._M_node[2]._M_parent;
  tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload._M_value = CVar17 + -0x19c1c;
  local_5d0[0] = (class_property<bool>)
                 (iVar16._M_node[2]._M_parent ==
                 (_Base_ptr)
                 tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
                 super__Optional_payload_base<long>._M_payload._M_value);
  local_5d0._8_8_ = (element_type *)0x0;
  sStack_5c0.pi_ = (sp_counted_base *)0x0;
  local_c18._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_c18._8_8_ = "";
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  miniminer_pool._0_8_ = &PTR__lazy_ostream_013abed0;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)local_5b0;
  miniminer_info.
  super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&tx3_bump_fee;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
       mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_013abed0;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&miniminer_info;
  pvVar20 = (iterator)0x1;
  pvVar21 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_5d0,(lazy_ostream *)&descendant_caches,1,2,REQUIRE,0xea41ed,
             (size_t)local_c18,0x1e2,&miniminer_pool,
             "very_high_feerate.GetFee(tx_vsizes[4] + tx_vsizes[5] + tx_vsizes[6]) - (high_fee + low_fee + med_fee)"
             ,&mini_miner_tx6_tx7);
  boost::detail::shared_count::~shared_count(&sStack_5c0);
  puVar9 = &((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped;
  miniminer_pool.m_ready_to_calculate = (bool)(puVar9->super_base_blob<256U>).m_data._M_elems[0];
  miniminer_pool._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
  miniminer_pool._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
  miniminer_pool._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
  miniminer_pool._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
  miniminer_pool._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
  miniminer_pool._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
  miniminer_pool._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_16_ =
       *(undefined1 (*) [16])
        (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  iVar16 = std::
           _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
           ::find(&bump_fees._M_t,(key_type *)&miniminer_pool);
  local_a58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_a50 = "";
  local_a68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a60 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar24 = 0x463e88;
  file_17.m_end = (iterator)0x1e4;
  file_17.m_begin = (iterator)&local_a58;
  msg_17.m_end = pvVar21;
  msg_17.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_a68,
             msg_17);
  mini_miner_tx6_tx7.m_ready_to_calculate =
       (_Rb_tree_header *)iVar16._M_node != &bump_fees._M_t._M_impl.super__Rb_tree_header;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
  descendant_caches._M_t._M_impl._0_8_ = anon_var_dwarf_d3a787;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = "";
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  miniminer_pool._0_8_ = &PTR__lazy_ostream_013abc70;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_a78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_a70 = "";
  pvVar20 = (iterator)0x1;
  pvVar21 = (iterator)0x0;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&descendant_caches;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&mini_miner_tx6_tx7,(lazy_ostream *)&miniminer_pool,1,0,WARN,
             _cVar24,(size_t)&local_a78,0x1e4);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header
            );
  local_a88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_a80 = "";
  local_a98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a90 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x1e6;
  file_18.m_begin = (iterator)&local_a88;
  msg_18.m_end = pvVar21;
  msg_18.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_a98,
             msg_18);
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
  descendant_caches._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abb30;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf6cf21;
  CVar17 = CFeeRate::GetFee(&very_high_feerate,
                            (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_start[5] +
                            (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_start[4] +
                            (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_start[7]);
  local_5b0._0_8_ = &iVar16._M_node[2]._M_parent;
  tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload._M_value = CVar17 + -0x30f34;
  local_5d0[0] = (class_property<bool>)
                 (class_property<bool>)
                 (iVar16._M_node[2]._M_parent ==
                 (_Base_ptr)
                 tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
                 super__Optional_payload_base<long>._M_payload._M_value);
  local_5d0._8_8_ = (element_type *)0x0;
  sStack_5c0.pi_ = (sp_counted_base *)0x0;
  local_c18._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_c18._8_8_ = (element_type *)0xea3807;
  miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
       miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  miniminer_pool._0_8_ = &PTR__lazy_ostream_013abed0;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)local_5b0;
  miniminer_info.
  super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&tx3_bump_fee;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
       mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_013abed0;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&miniminer_info;
  pvVar20 = (iterator)0x1;
  pvVar21 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_5d0,(lazy_ostream *)&descendant_caches,1,2,REQUIRE,0xea4286,
             (size_t)local_c18,0x1e6,&miniminer_pool,
             "very_high_feerate.GetFee(tx_vsizes[4] + tx_vsizes[5] + tx_vsizes[7]) - (high_fee + low_fee + high_fee)"
             ,&mini_miner_tx6_tx7);
  boost::detail::shared_count::~shared_count(&sStack_5c0);
  puVar9 = &((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped;
  mini_miner_tx6_tx7.m_ready_to_calculate = (bool)(puVar9->super_base_blob<256U>).m_data._M_elems[0]
  ;
  mini_miner_tx6_tx7._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
  mini_miner_tx6_tx7._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
  mini_miner_tx6_tx7._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
  mini_miner_tx6_tx7._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
  mini_miner_tx6_tx7._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
  mini_miner_tx6_tx7._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
  mini_miner_tx6_tx7._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ =
       *(undefined1 (*) [16])
        (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0
  ;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._20_8_ =
       *(undefined8 *)
        ((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
        m_wrapped.super_base_blob<256U>.m_data._M_elems;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._28_8_ =
       *(undefined8 *)
        (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  mini_miner_tx6_tx7._52_8_ =
       *(undefined8 *)
        (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  mini_miner_tx6_tx7.m_requested_outpoints_by_txid._M_t._M_impl._4_8_ =
       *(undefined8 *)
        (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  mini_miner_tx6_tx7.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _4_4_ = 1;
  __l_09._M_len = 2;
  __l_09._M_array = (iterator)&mini_miner_tx6_tx7;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&descendant_caches,__l_09,
             (allocator_type *)local_5d0);
  ::node::MiniMiner::MiniMiner
            (&miniminer_pool,this_00,
             (vector<COutPoint,_std::allocator<COutPoint>_> *)&descendant_caches);
  if (descendant_caches._M_t._M_impl._0_8_ != 0) {
    operator_delete((void *)descendant_caches._M_t._M_impl._0_8_,
                    (long)descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent -
                    descendant_caches._M_t._M_impl._0_8_);
  }
  local_aa8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_aa0 = "";
  local_ab8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ab0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar24 = 0x464195;
  file_19.m_end = (iterator)0x1e9;
  file_19.m_begin = (iterator)&local_aa8;
  msg_19.m_end = pvVar21;
  msg_19.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_ab8,
             msg_19);
  descendant_caches._M_t._M_impl._0_1_ = miniminer_pool.m_ready_to_calculate;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_5d0._0_8_ = "mini_miner_total_tx3.IsReadyToCalculate()";
  local_5d0._8_8_ = "";
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
       mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_013abc70;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_ac8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_ac0 = "";
  pvVar20 = (iterator)0x1;
  pvVar21 = (iterator)0x0;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)local_5d0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&descendant_caches,(lazy_ostream *)&mini_miner_tx6_tx7,1,0,WARN,
             _cVar24,(size_t)&local_ac8,0x1e9);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  oVar23 = ::node::MiniMiner::CalculateTotalBumpFees(&miniminer_pool,&very_high_feerate);
  tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload._M_value =
       oVar23.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
       _M_payload;
  tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_engaged = oVar23.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_engaged;
  local_ad8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_ad0 = "";
  local_ae8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ae0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar24 = 0x464287;
  file_20.m_end = (iterator)0x1eb;
  file_20.m_begin = (iterator)&local_ad8;
  msg_20.m_end = pvVar21;
  msg_20.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_ae8,
             msg_20);
  descendant_caches._M_t._M_impl._0_1_ = miniminer_pool.m_ready_to_calculate ^ 1;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_5d0._0_8_ = "!mini_miner_total_tx3.IsReadyToCalculate()";
  local_5d0._8_8_ = "";
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
       mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_013abc70;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_af8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_af0 = "";
  pvVar20 = (iterator)0x1;
  pvVar21 = (iterator)0x0;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)local_5d0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&descendant_caches,(lazy_ostream *)&mini_miner_tx6_tx7,1,0,WARN,
             _cVar24,(size_t)&local_af8,0x1eb);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  local_b08 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_b00 = "";
  local_b18 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b10 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar24 = 0x464350;
  file_21.m_end = (iterator)0x1ec;
  file_21.m_begin = (iterator)&local_b08;
  msg_21.m_end = pvVar21;
  msg_21.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_b18,
             msg_21);
  descendant_caches._M_t._M_impl._0_1_ =
       tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._M_engaged;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_5d0._0_8_ = "tx3_bump_fee.has_value()";
  local_5d0._8_8_ = (element_type *)0xea4344;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
       mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
  mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_013abc70;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_b28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_b20 = "";
  pvVar20 = (iterator)0x1;
  pvVar21 = (iterator)0x0;
  mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)local_5d0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&descendant_caches,(lazy_ostream *)&mini_miner_tx6_tx7,1,0,WARN,
             _cVar24,(size_t)&local_b28,0x1ec);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  local_b38 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_b30 = "";
  local_b48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b40 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x1ee;
  file_22.m_begin = (iterator)&local_b38;
  msg_22.m_end = pvVar21;
  msg_22.m_begin = pvVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_b48,
             msg_22);
  local_5d0._8_8_ = local_5d0._9_8_ << 8;
  local_5d0._0_8_ = &PTR__lazy_ostream_013abb30;
  sStack_5c0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5b8 = (_Base_ptr)0xf6cf21;
  if (tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_engaged == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    CVar17 = CFeeRate::GetFee(&very_high_feerate,
                              (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl
                                   .super__Vector_impl_data._M_start[1] +
                              (int)*tx_vsizes.super__Vector_base<long,_std::allocator<long>_>.
                                    _M_impl.super__Vector_impl_data._M_start +
                              (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl
                                   .super__Vector_impl_data._M_start[2] +
                              (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl
                                   .super__Vector_impl_data._M_start[3]);
    just_below_tx4.nSatoshisPerK = CVar17 + -0x322bc;
    tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>._M_payload._M_value = (long)&just_below_tx4;
    local_c18[0] = tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
                   super__Optional_payload_base<long>._M_payload._M_value ==
                   just_below_tx4.nSatoshisPerK;
    local_c18._8_8_ = (element_type *)0x0;
    sStack_c08.pi_ = (sp_counted_base *)0x0;
    local_5b0._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
    ;
    local_5b0._8_8_ = (element_type *)0xea3807;
    miniminer_info.
    super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&tx3_bump_fee;
    mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
         mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
    mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_013abed0;
    mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         boost::unit_test::lazy_ostream::inst;
    mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&miniminer_info;
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
    descendant_caches._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abed0;
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)&tx6_tx7_bumpfee;
    pvVar20 = (iterator)0x1;
    pvVar21 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_c18,(lazy_ostream *)local_5d0,1,2,REQUIRE,0xea4345,
               (size_t)local_5b0,0x1ee,&mini_miner_tx6_tx7,
               "very_high_feerate.GetFee(tx_vsizes[0] + tx_vsizes[1] + tx_vsizes[2] + tx_vsizes[3]) - (low_fee + med_fee + high_fee + high_fee)"
               ,(assertion_result *)&descendant_caches);
    boost::detail::shared_count::~shared_count(&sStack_c08);
    puVar9 = &((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash
              ).m_wrapped;
    descendant_caches._M_t._M_impl._0_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[0];
    descendant_caches._M_t._M_impl._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
    descendant_caches._M_t._M_impl._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
    descendant_caches._M_t._M_impl._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
    descendant_caches._M_t._M_impl._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
    descendant_caches._M_t._M_impl._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
    descendant_caches._M_t._M_impl._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
    descendant_caches._M_t._M_impl._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_16_ =
         *(undefined1 (*) [16])
          (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
           m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         *(_Base_ptr *)
          (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
           m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ = 0;
    uVar5 = *(undefined8 *)
             ((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems;
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ =
         (undefined4)uVar5;
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
         (undefined4)((ulong)uVar5 >> 0x20);
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
         (undefined4)
         *(undefined8 *)
          (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
           m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
    __l_10._M_len = 2;
    __l_10._M_array = (iterator)&descendant_caches;
    std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
              ((vector<COutPoint,_std::allocator<COutPoint>_> *)local_5d0,__l_10,
               (allocator_type *)local_c18);
    ::node::MiniMiner::MiniMiner
              (&mini_miner_tx6_tx7,this_00,
               (vector<COutPoint,_std::allocator<COutPoint>_> *)local_5d0);
    if ((pointer)local_5d0._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_5d0._0_8_,(long)sStack_5c0.pi_ - local_5d0._0_8_);
    }
    local_b58 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
    ;
    local_b50 = "";
    local_b68 = &boost::unit_test::basic_cstring<char_const>::null;
    local_b60 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar24 = 0x464655;
    file_23.m_end = (iterator)0x1f1;
    file_23.m_begin = (iterator)&local_b58;
    msg_23.m_end = pvVar21;
    msg_23.m_begin = pvVar20;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_b68,
               msg_23);
    local_5d0[0] = (class_property<bool>)
                   (class_property<bool>)mini_miner_tx6_tx7.m_ready_to_calculate;
    local_5d0._8_8_ = (element_type *)0x0;
    sStack_5c0.pi_ = (sp_counted_base *)0x0;
    local_c18._0_8_ = "mini_miner_tx6_tx7.IsReadyToCalculate()";
    local_c18._8_8_ = "";
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
    descendant_caches._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abc70;
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    local_b78 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
    ;
    local_b70 = "";
    pvVar20 = (iterator)0x1;
    pvVar21 = (iterator)0x0;
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_c18;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_5d0,(lazy_ostream *)&descendant_caches,1,0,WARN,_cVar24,
               (size_t)&local_b78,0x1f1);
    boost::detail::shared_count::~shared_count(&sStack_5c0);
    oVar23 = ::node::MiniMiner::CalculateTotalBumpFees(&mini_miner_tx6_tx7,&very_high_feerate);
    tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>._M_payload._M_value =
         oVar23.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
         ._M_payload;
    tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>._M_engaged =
         oVar23.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
         ._M_engaged;
    local_b88 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
    ;
    local_b80 = "";
    local_b98 = &boost::unit_test::basic_cstring<char_const>::null;
    local_b90 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar24 = 0x46474e;
    file_24.m_end = (iterator)0x1f3;
    file_24.m_begin = (iterator)&local_b88;
    msg_24.m_end = pvVar21;
    msg_24.m_begin = pvVar20;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_b98,
               msg_24);
    local_5d0[0] = (class_property<bool>)(mini_miner_tx6_tx7.m_ready_to_calculate ^ 1);
    local_5d0._8_8_ = (element_type *)0x0;
    sStack_5c0.pi_ = (sp_counted_base *)0x0;
    local_c18._0_8_ = "!mini_miner_tx6_tx7.IsReadyToCalculate()";
    local_c18._8_8_ = "";
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
    descendant_caches._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abc70;
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    local_ba8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
    ;
    local_ba0 = "";
    pvVar20 = (iterator)0x1;
    pvVar21 = (iterator)0x0;
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_c18;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_5d0,(lazy_ostream *)&descendant_caches,1,0,WARN,_cVar24,
               (size_t)&local_ba8,499);
    boost::detail::shared_count::~shared_count(&sStack_5c0);
    local_bb8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
    ;
    local_bb0 = "";
    local_bc8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_bc0 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar24 = 0x46481e;
    file_25.m_end = (iterator)0x1f4;
    file_25.m_begin = (iterator)&local_bb8;
    msg_25.m_end = pvVar21;
    msg_25.m_begin = pvVar20;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_bc8,
               msg_25);
    local_5d0[0] = (class_property<bool>)
                   (class_property<bool>)
                   tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
                   super__Optional_payload_base<long>._M_engaged;
    local_5d0._8_8_ = (element_type *)0x0;
    sStack_5c0.pi_ = (sp_counted_base *)0x0;
    local_c18._0_8_ = "tx6_tx7_bumpfee.has_value()";
    local_c18._8_8_ = (element_type *)0xea439e;
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
    descendant_caches._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abc70;
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    local_bd8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
    ;
    local_bd0 = "";
    pvVar20 = (iterator)0x1;
    pvVar21 = (iterator)0x0;
    descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_c18;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_5d0,(lazy_ostream *)&descendant_caches,1,0,WARN,_cVar24,
               (size_t)&local_bd8,500);
    boost::detail::shared_count::~shared_count(&sStack_5c0);
    local_be8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
    ;
    local_be0 = "";
    local_bf8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_bf0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_26.m_end = (iterator)0x1f6;
    file_26.m_begin = (iterator)&local_be8;
    msg_26.m_end = pvVar21;
    msg_26.m_begin = pvVar20;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_bf8,
               msg_26);
    local_c18._8_8_ = local_c18._9_8_ << 8;
    local_c18._0_8_ = &PTR__lazy_ostream_013abb30;
    sStack_c08.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_c00 = (_Base_ptr)0xf6cf21;
    if (tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_engaged == false) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        std::__throw_bad_optional_access();
      }
    }
    else {
      CVar17 = CFeeRate::GetFee(&very_high_feerate,
                                (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>.
                                     _M_impl.super__Vector_impl_data._M_start[5] +
                                (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>.
                                     _M_impl.super__Vector_impl_data._M_start[4] +
                                (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>.
                                     _M_impl.super__Vector_impl_data._M_start[6] +
                                (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>.
                                     _M_impl.super__Vector_impl_data._M_start[7]);
      descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)&just_below_tx4;
      local_c20 = (undefined1  [8])(CVar17 + -0x322bc);
      local_5e0 = (undefined1  [8])local_c20;
      local_5b0[0] = (class_property<bool>)
                     (class_property<bool>)
                     ((undefined1  [8])
                      tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
                      super__Optional_payload_base<long>._M_payload._M_value == local_c20);
      local_5b0._8_8_ = (element_type *)0x0;
      sStack_5a0.pi_ = (sp_counted_base *)0x0;
      miniminer_info.
      super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0xea3807;
      miniminer_info.
      super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      just_below_tx4.nSatoshisPerK = (CAmount)&tx6_tx7_bumpfee;
      descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
      descendant_caches._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abed0;
      descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)boost::unit_test::lazy_ostream::inst;
      local_5b8 = (_Base_ptr)local_5e0;
      local_5d0._8_8_ = local_5d0._9_8_ << 8;
      local_5d0._0_8_ = &PTR__lazy_ostream_013abed0;
      sStack_5c0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      pvVar20 = (iterator)0x1;
      pvVar21 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_5b0,(lazy_ostream *)local_c18,1,2,REQUIRE,0xea439f,
                 (size_t)&miniminer_info,0x1f6,(_Base_ptr)&descendant_caches,
                 "very_high_feerate.GetFee(tx_vsizes[4] + tx_vsizes[5] + tx_vsizes[6] + tx_vsizes[7]) - (high_fee + low_fee + med_fee + high_fee)"
                 ,(assertion_result *)local_5d0);
      boost::detail::shared_count::~shared_count(&sStack_5a0);
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>_>
      ::~_Rb_tree(&mini_miner_tx6_tx7.m_descendant_set_by_txid._M_t);
      if (mini_miner_tx6_tx7.m_entries.
          super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(mini_miner_tx6_tx7.m_entries.
                        super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)mini_miner_tx6_tx7.m_entries.
                              super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)mini_miner_tx6_tx7.m_entries.
                              super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_node::MiniMinerMempoolEntry>,_std::_Select1st<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
      ::~_Rb_tree(&mini_miner_tx6_tx7.m_entries_by_txid._M_t);
      std::
      _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
      ::~_Rb_tree(&mini_miner_tx6_tx7.m_in_block._M_t);
      std::
      _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
      ::~_Rb_tree(&mini_miner_tx6_tx7.m_bump_fees._M_t);
      std::
      _Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_unsigned_int>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_unsigned_int>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
      ::~_Rb_tree(&mini_miner_tx6_tx7.m_inclusion_order._M_t);
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>_>
      ::~_Rb_tree(&mini_miner_tx6_tx7.m_requested_outpoints_by_txid._M_t);
      std::
      _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
      ::~_Rb_tree(&mini_miner_tx6_tx7.m_to_be_replaced._M_t);
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>_>
      ::~_Rb_tree(&miniminer_pool.m_descendant_set_by_txid._M_t);
      if (miniminer_pool.m_entries.
          super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(miniminer_pool.m_entries.
                        super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)miniminer_pool.m_entries.
                              super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)miniminer_pool.m_entries.
                              super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_node::MiniMinerMempoolEntry>,_std::_Select1st<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
      ::~_Rb_tree(&miniminer_pool.m_entries_by_txid._M_t);
      std::
      _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
      ::~_Rb_tree(&miniminer_pool.m_in_block._M_t);
      std::
      _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
      ::~_Rb_tree(&miniminer_pool.m_bump_fees._M_t);
      std::
      _Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_unsigned_int>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_unsigned_int>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
      ::~_Rb_tree(&miniminer_pool.m_inclusion_order._M_t);
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>_>
      ::~_Rb_tree(&miniminer_pool.m_requested_outpoints_by_txid._M_t);
      std::
      _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
      ::~_Rb_tree(&miniminer_pool.m_to_be_replaced._M_t);
      std::
      _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
      ::~_Rb_tree((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                   *)&bump_fees);
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>_>
      ::~_Rb_tree(&miniminer_manual.m_descendant_set_by_txid._M_t);
      if (miniminer_manual.m_entries.
          super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(miniminer_manual.m_entries.
                        super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        CONCAT44(miniminer_manual.m_entries.
                                 super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                 miniminer_manual.m_entries.
                                 super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) -
                        (long)miniminer_manual.m_entries.
                              super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_node::MiniMinerMempoolEntry>,_std::_Select1st<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
      ::~_Rb_tree(&miniminer_manual.m_entries_by_txid._M_t);
      std::
      _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
      ::~_Rb_tree(&miniminer_manual.m_in_block._M_t);
      std::
      _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
      ::~_Rb_tree(&miniminer_manual.m_bump_fees._M_t);
      std::
      _Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_unsigned_int>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_unsigned_int>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
      ::~_Rb_tree(&miniminer_manual.m_inclusion_order._M_t);
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>_>
      ::~_Rb_tree(&miniminer_manual.m_requested_outpoints_by_txid._M_t);
      std::
      _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
      ::~_Rb_tree(&miniminer_manual.m_to_be_replaced._M_t);
      just_below_tx4.nSatoshisPerK = tx4_feerate.nSatoshisPerK + -5;
      ::node::MiniMiner::MiniMiner(&miniminer_manual,this_00,&all_unspent_outpoints);
      local_c30 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_c28 = "";
      local_c40 = &boost::unit_test::basic_cstring<char_const>::null;
      local_c38 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar24 = 0x464c57;
      file_27.m_end = (iterator)0x1fc;
      file_27.m_begin = (iterator)&local_c30;
      msg_27.m_end = pvVar21;
      msg_27.m_begin = pvVar20;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_c40,
                 msg_27);
      mini_miner_tx6_tx7.m_ready_to_calculate = miniminer_manual.m_ready_to_calculate;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
      descendant_caches._M_t._M_impl._0_8_ = (long)"!mini_miner.IsReadyToCalculate()" + 1;
      descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = "";
      miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
           miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
      miniminer_pool._0_8_ = &PTR__lazy_ostream_013abc70;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           boost::unit_test::lazy_ostream::inst;
      local_c50 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_c48 = "";
      pvVar20 = (iterator)0x1;
      pvVar21 = (iterator)0x0;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&descendant_caches;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&mini_miner_tx6_tx7,(lazy_ostream *)&miniminer_pool,1,0,WARN,
                 _cVar24,(size_t)&local_c50,0x1fc);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
      ::node::MiniMiner::CalculateBumpFees
                ((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                  *)&descendant_caches,&miniminer_manual,&just_below_tx4);
      local_c60 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_c58 = "";
      local_c70 = &boost::unit_test::basic_cstring<char_const>::null;
      local_c68 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar24 = 0x464d3b;
      file_28.m_end = (iterator)0x1fe;
      file_28.m_begin = (iterator)&local_c60;
      msg_28.m_end = pvVar21;
      msg_28.m_begin = pvVar20;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_c70,
                 msg_28);
      mini_miner_tx6_tx7._0_8_ =
           CONCAT71(mini_miner_tx6_tx7._1_7_,miniminer_manual.m_ready_to_calculate) ^ 1;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
      bump_fees._M_t._M_impl._0_8_ = anon_var_dwarf_d3a3c4;
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = "";
      miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
           miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
      miniminer_pool._0_8_ = &PTR__lazy_ostream_013abc70;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           boost::unit_test::lazy_ostream::inst;
      local_c80 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_c78 = "";
      pvVar20 = (iterator)0x1;
      pvVar21 = (iterator)0x0;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&bump_fees;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&mini_miner_tx6_tx7,(lazy_ostream *)&miniminer_pool,1,0,WARN,
                 _cVar24,(size_t)&local_c80,0x1fe);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
      local_c90 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_c88 = "";
      local_ca0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_c98 = &boost::unit_test::basic_cstring<char_const>::null;
      file_29.m_end = (iterator)0x1ff;
      file_29.m_begin = (iterator)&local_c90;
      msg_29.m_end = pvVar21;
      msg_29.m_begin = pvVar20;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_ca0,
                 msg_29);
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
      bump_fees._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abb30;
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)boost::unit_test::lazy_ostream::inst;
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf6cf21;
      tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_payload._M_value._4_4_ =
           descendant_caches._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
      tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_payload._M_value._0_4_ =
           (undefined4)descendant_caches._M_t._M_impl.super__Rb_tree_header._M_node_count;
      tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_payload._M_value =
           ((long)all_unspent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)all_unspent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 2) * -0x71c71c71c71c71c7;
      local_5d0._8_8_ = (element_type *)0x0;
      sStack_5c0.pi_ = (sp_counted_base *)0x0;
      local_c18._0_8_ =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_c18._8_8_ = "";
      local_5b0._0_8_ = &tx3_bump_fee;
      miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
           miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
      miniminer_pool._0_8_ = &PTR__lazy_ostream_013abb70;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           boost::unit_test::lazy_ostream::inst;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)local_5b0;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
           mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
      mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_013abb70;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           boost::unit_test::lazy_ostream::inst;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&miniminer_info;
      pvVar20 = (iterator)0x1;
      pvVar21 = (iterator)0x2;
      local_5d0[0] = (class_property<bool>)
                     (class_property<bool>)
                     (tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
                      super__Optional_payload_base<long>._M_payload._M_value ==
                     tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long>._M_payload._M_value);
      miniminer_info.
      super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)&tx6_tx7_bumpfee;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_5d0,(lazy_ostream *)&bump_fees,1,2,REQUIRE,0xea3b63,
                 (size_t)local_c18,0x1ff,&miniminer_pool,"all_unspent_outpoints.size()",
                 &mini_miner_tx6_tx7);
      boost::detail::shared_count::~shared_count(&sStack_5c0);
      local_cb0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_ca8 = "";
      local_cc0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_cb8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_30.m_end = (iterator)0x200;
      file_30.m_begin = (iterator)&local_cb0;
      msg_30.m_end = pvVar21;
      msg_30.m_begin = pvVar20;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_cc0,
                 msg_30);
      _cVar24 = 0x464faa;
      bVar12 = sanity_check(&all_transactions,
                            (map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                             *)&descendant_caches);
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
      bump_fees._M_t._M_impl._0_8_ = anon_var_dwarf_d3a3dd;
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           (long)"sanity_check(all_transactions, bump_fees)" + 0x29;
      miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
           miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
      miniminer_pool._0_8_ = &PTR__lazy_ostream_013abc70;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           boost::unit_test::lazy_ostream::inst;
      local_cd0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_cc8 = "";
      pvVar20 = (iterator)0x1;
      pvVar21 = (iterator)0x0;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&bump_fees;
      mini_miner_tx6_tx7.m_ready_to_calculate = bVar12;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&mini_miner_tx6_tx7,(lazy_ostream *)&miniminer_pool,1,0,WARN,
                 _cVar24,(size_t)&local_cd0,0x200);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
      puVar9 = &((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped;
      miniminer_pool.m_ready_to_calculate = (bool)(puVar9->super_base_blob<256U>).m_data._M_elems[0]
      ;
      miniminer_pool._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
      miniminer_pool._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
      miniminer_pool._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
      miniminer_pool._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
      miniminer_pool._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
      miniminer_pool._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
      miniminer_pool._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._0_16_ =
           *(undefined1 (*) [16])
            (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           *(_Base_ptr *)
            (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0
      ;
      iVar16 = std::
               _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
               ::find((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                       *)&descendant_caches,(key_type *)&miniminer_pool);
      local_ce0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_cd8 = "";
      local_cf0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_ce8 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar24 = 0x4650c7;
      file_31.m_end = (iterator)0x202;
      file_31.m_begin = (iterator)&local_ce0;
      msg_31.m_end = pvVar21;
      msg_31.m_begin = pvVar20;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_cf0,
                 msg_31);
      mini_miner_tx6_tx7.m_ready_to_calculate =
           (_Rb_tree_header *)iVar16._M_node !=
           &descendant_caches._M_t._M_impl.super__Rb_tree_header;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
      bump_fees._M_t._M_impl._0_8_ = anon_var_dwarf_d3a755;
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = "";
      miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
           miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
      miniminer_pool._0_8_ = &PTR__lazy_ostream_013abc70;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           boost::unit_test::lazy_ostream::inst;
      local_d00 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_cf8 = "";
      pvVar20 = (iterator)0x1;
      pvVar21 = (iterator)0x0;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&bump_fees;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&mini_miner_tx6_tx7,(lazy_ostream *)&miniminer_pool,1,0,WARN,
                 _cVar24,(size_t)&local_d00,0x202);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
      local_d10 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_d08 = "";
      local_d20 = &boost::unit_test::basic_cstring<char_const>::null;
      local_d18 = &boost::unit_test::basic_cstring<char_const>::null;
      file_32.m_end = (iterator)0x203;
      file_32.m_begin = (iterator)&local_d10;
      msg_32.m_end = pvVar21;
      msg_32.m_begin = pvVar20;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_d20,
                 msg_32);
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
      bump_fees._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abb30;
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)boost::unit_test::lazy_ostream::inst;
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf6cf21;
      CVar17 = CFeeRate::GetFee(&just_below_tx4,
                                (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>.
                                     _M_impl.super__Vector_impl_data._M_start[6] +
                                (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>.
                                     _M_impl.super__Vector_impl_data._M_start[5]);
      local_5b0._0_8_ = &iVar16._M_node[2]._M_parent;
      tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_payload._M_value = CVar17 + -0x157c;
      local_5d0[0] = (class_property<bool>)
                     (iVar16._M_node[2]._M_parent ==
                     (_Base_ptr)
                     tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long>._M_payload._M_value);
      local_5d0._8_8_ = (element_type *)0x0;
      sStack_5c0.pi_ = (sp_counted_base *)0x0;
      local_c18._0_8_ =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_c18._8_8_ = "";
      miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
           miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
      miniminer_pool._0_8_ = &PTR__lazy_ostream_013abed0;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           boost::unit_test::lazy_ostream::inst;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)local_5b0;
      miniminer_info.
      super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)&tx3_bump_fee;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
           mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
      mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_013abed0;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           boost::unit_test::lazy_ostream::inst;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&miniminer_info;
      pvVar20 = (iterator)0x1;
      pvVar21 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_5d0,(lazy_ostream *)&bump_fees,1,2,REQUIRE,0xea41ed,
                 (size_t)local_c18,0x203,&miniminer_pool,
                 "just_below_tx4.GetFee(tx_vsizes[5] + tx_vsizes[6]) - (low_fee + med_fee)",
                 &mini_miner_tx6_tx7);
      boost::detail::shared_count::~shared_count(&sStack_5c0);
      puVar9 = &((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped;
      miniminer_pool.m_ready_to_calculate = (bool)(puVar9->super_base_blob<256U>).m_data._M_elems[0]
      ;
      miniminer_pool._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
      miniminer_pool._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
      miniminer_pool._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
      miniminer_pool._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
      miniminer_pool._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
      miniminer_pool._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
      miniminer_pool._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._0_16_ =
           *(undefined1 (*) [16])
            (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           *(_Base_ptr *)
            (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0
      ;
      iVar16 = std::
               _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
               ::find((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                       *)&descendant_caches,(key_type *)&miniminer_pool);
      local_d30 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_d28 = "";
      local_d40 = &boost::unit_test::basic_cstring<char_const>::null;
      local_d38 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar24 = 0x46536d;
      file_33.m_end = (iterator)0x205;
      file_33.m_begin = (iterator)&local_d30;
      msg_33.m_end = pvVar21;
      msg_33.m_begin = pvVar20;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_d40,
                 msg_33);
      mini_miner_tx6_tx7.m_ready_to_calculate =
           (_Rb_tree_header *)iVar16._M_node !=
           &descendant_caches._M_t._M_impl.super__Rb_tree_header;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
      bump_fees._M_t._M_impl._0_8_ = anon_var_dwarf_d3a787;
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = "";
      miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
           miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
      miniminer_pool._0_8_ = &PTR__lazy_ostream_013abc70;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           boost::unit_test::lazy_ostream::inst;
      local_d50 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_d48 = "";
      pvVar20 = (iterator)0x1;
      pvVar21 = (iterator)0x0;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&bump_fees;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&mini_miner_tx6_tx7,(lazy_ostream *)&miniminer_pool,1,0,WARN,
                 _cVar24,(size_t)&local_d50,0x205);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
      local_d60 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_d58 = "";
      local_d70 = &boost::unit_test::basic_cstring<char_const>::null;
      local_d68 = &boost::unit_test::basic_cstring<char_const>::null;
      file_34.m_end = (iterator)0x206;
      file_34.m_begin = (iterator)&local_d60;
      msg_34.m_end = pvVar21;
      msg_34.m_begin = pvVar20;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_d70,
                 msg_34);
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
      bump_fees._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abb30;
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)boost::unit_test::lazy_ostream::inst;
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf6cf21;
      CVar17 = CFeeRate::GetFee(&just_below_tx4,
                                (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>.
                                     _M_impl.super__Vector_impl_data._M_start[7] +
                                (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>.
                                     _M_impl.super__Vector_impl_data._M_start[5]);
      local_5b0._0_8_ = &iVar16._M_node[2]._M_parent;
      tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_payload._M_value = CVar17 + -0x18894;
      local_5d0[0] = (class_property<bool>)
                     (class_property<bool>)
                     (iVar16._M_node[2]._M_parent ==
                     (_Base_ptr)
                     tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long>._M_payload._M_value);
      local_5d0._8_8_ = (element_type *)0x0;
      sStack_5c0.pi_ = (sp_counted_base *)0x0;
      local_c18._0_8_ =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_c18._8_8_ = (element_type *)0xea3807;
      miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
           miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
      miniminer_pool._0_8_ = &PTR__lazy_ostream_013abed0;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           boost::unit_test::lazy_ostream::inst;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)local_5b0;
      miniminer_info.
      super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)&tx3_bump_fee;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
           mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
      mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_013abed0;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           boost::unit_test::lazy_ostream::inst;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&miniminer_info;
      pvVar20 = (iterator)0x1;
      pvVar21 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_5d0,(lazy_ostream *)&bump_fees,1,2,REQUIRE,0xea4286,
                 (size_t)local_c18,0x206,&miniminer_pool,
                 "just_below_tx4.GetFee(tx_vsizes[5] + tx_vsizes[7]) - (low_fee + high_fee)",
                 &mini_miner_tx6_tx7);
      boost::detail::shared_count::~shared_count(&sStack_5c0);
      puVar9 = &((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped;
      mini_miner_tx6_tx7.m_ready_to_calculate =
           (bool)(puVar9->super_base_blob<256U>).m_data._M_elems[0];
      mini_miner_tx6_tx7._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
      mini_miner_tx6_tx7._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
      mini_miner_tx6_tx7._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
      mini_miner_tx6_tx7._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
      mini_miner_tx6_tx7._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
      mini_miner_tx6_tx7._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
      mini_miner_tx6_tx7._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ =
           *(undefined1 (*) [16])
            (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           *(_Base_ptr *)
            (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_
           = 0;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._20_8_ =
           *(undefined8 *)
            ((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._28_8_ =
           *(undefined8 *)
            (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      mini_miner_tx6_tx7._52_8_ =
           *(undefined8 *)
            (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      mini_miner_tx6_tx7.m_requested_outpoints_by_txid._M_t._M_impl._4_8_ =
           *(undefined8 *)
            (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      mini_miner_tx6_tx7.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _4_4_ = 0;
      __l_11._M_len = 2;
      __l_11._M_array = (iterator)&mini_miner_tx6_tx7;
      std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
                ((vector<COutPoint,_std::allocator<COutPoint>_> *)&bump_fees,__l_11,
                 (allocator_type *)local_5d0);
      ::node::MiniMiner::MiniMiner
                (&miniminer_pool,this_00,(vector<COutPoint,_std::allocator<COutPoint>_> *)&bump_fees
                );
      if (bump_fees._M_t._M_impl._0_8_ != 0) {
        operator_delete((void *)bump_fees._M_t._M_impl._0_8_,
                        (long)bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent -
                        bump_fees._M_t._M_impl._0_8_);
      }
      local_d80 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_d78 = "";
      local_d90 = &boost::unit_test::basic_cstring<char_const>::null;
      local_d88 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar24 = 0x465678;
      file_35.m_end = (iterator)0x209;
      file_35.m_begin = (iterator)&local_d80;
      msg_35.m_end = pvVar21;
      msg_35.m_begin = pvVar20;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_d90,
                 msg_35);
      bump_fees._M_t._M_impl._0_1_ = miniminer_pool.m_ready_to_calculate;
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_5d0._0_8_ = "mini_miner_tx6_tx7.IsReadyToCalculate()";
      local_5d0._8_8_ = "";
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
           mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
      mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_013abc70;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           boost::unit_test::lazy_ostream::inst;
      local_da0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_d98 = "";
      pvVar20 = (iterator)0x1;
      pvVar21 = (iterator)0x0;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)local_5d0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&bump_fees,(lazy_ostream *)&mini_miner_tx6_tx7,1,0,WARN,_cVar24
                 ,(size_t)&local_da0,0x209);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      oVar23 = ::node::MiniMiner::CalculateTotalBumpFees(&miniminer_pool,&just_below_tx4);
      miniminer_info.
      super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
      _M_impl.super__Vector_impl_data._0_9_ =
           oVar23.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._0_9_;
      local_db0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_da8 = "";
      local_dc0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_db8 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar24 = 0x46576a;
      file_36.m_end = (iterator)0x20b;
      file_36.m_begin = (iterator)&local_db0;
      msg_36.m_end = pvVar21;
      msg_36.m_begin = pvVar20;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_dc0,
                 msg_36);
      bump_fees._M_t._M_impl._0_1_ = miniminer_pool.m_ready_to_calculate ^ 1;
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_5d0._0_8_ = "!mini_miner_tx6_tx7.IsReadyToCalculate()";
      local_5d0._8_8_ = "";
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
           mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
      mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_013abc70;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           boost::unit_test::lazy_ostream::inst;
      local_dd0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_dc8 = "";
      pvVar20 = (iterator)0x1;
      pvVar21 = (iterator)0x0;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)local_5d0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&bump_fees,(lazy_ostream *)&mini_miner_tx6_tx7,1,0,WARN,_cVar24
                 ,(size_t)&local_dd0,0x20b);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      local_de0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_dd8 = "";
      local_df0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_de8 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar24 = 0x465833;
      file_37.m_end = (iterator)0x20c;
      file_37.m_begin = (iterator)&local_de0;
      msg_37.m_end = pvVar21;
      msg_37.m_begin = pvVar20;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_df0,
                 msg_37);
      bump_fees._M_t._M_impl._0_1_ =
           (char)miniminer_info.
                 super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_5d0._0_8_ = "tx6_tx7_bumpfee.has_value()";
      local_5d0._8_8_ = (element_type *)0xea439e;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
           mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
      mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_013abc70;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           boost::unit_test::lazy_ostream::inst;
      local_e00 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_df8 = "";
      pvVar20 = (iterator)0x1;
      pvVar21 = (iterator)0x0;
      mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)local_5d0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&bump_fees,(lazy_ostream *)&mini_miner_tx6_tx7,1,0,WARN,_cVar24
                 ,(size_t)&local_e00,0x20c);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      local_e10 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_e08 = "";
      local_e20 = &boost::unit_test::basic_cstring<char_const>::null;
      local_e18 = &boost::unit_test::basic_cstring<char_const>::null;
      file_38.m_end = (iterator)0x20d;
      file_38.m_begin = (iterator)&local_e10;
      msg_38.m_end = pvVar21;
      msg_38.m_begin = pvVar20;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_e20,
                 msg_38);
      local_5d0._8_8_ = local_5d0._9_8_ << 8;
      local_5d0._0_8_ = &PTR__lazy_ostream_013abb30;
      sStack_5c0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_5b8 = (_Base_ptr)0xf6cf21;
      if ((char)miniminer_info.
                super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish == '\0') {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          std::__throw_bad_optional_access();
        }
      }
      else {
        CVar17 = CFeeRate::GetFee(&just_below_tx4,
                                  (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>.
                                       _M_impl.super__Vector_impl_data._M_start[6] +
                                  (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>.
                                       _M_impl.super__Vector_impl_data._M_start[5]);
        local_5e0 = (undefined1  [8])(CVar17 + -0x157c);
        local_c18[0] = (undefined1  [8])
                       miniminer_info.
                       super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start == local_5e0;
        local_c18._8_8_ = (element_type *)0x0;
        sStack_c08.pi_ = (sp_counted_base *)0x0;
        local_5b0._0_8_ =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_5b0._8_8_ = (element_type *)0xea3807;
        tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_payload._M_value = (long)&miniminer_info;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
             mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
        mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_013abed0;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             boost::unit_test::lazy_ostream::inst;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&tx3_bump_fee;
        tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_payload._M_value = (long)local_5e0;
        bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
        bump_fees._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abed0;
        bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
        bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&tx6_tx7_bumpfee
        ;
        pvVar20 = (iterator)0x1;
        pvVar21 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_c18,(lazy_ostream *)local_5d0,1,2,REQUIRE,0xea439f,
                   (size_t)local_5b0,0x20d,&mini_miner_tx6_tx7,
                   "just_below_tx4.GetFee(tx_vsizes[5] + tx_vsizes[6]) - (low_fee + med_fee)",
                   (assertion_result *)&bump_fees);
        boost::detail::shared_count::~shared_count(&sStack_c08);
        std::
        _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>_>
        ::~_Rb_tree(&miniminer_pool.m_descendant_set_by_txid._M_t);
        if (miniminer_pool.m_entries.
            super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(miniminer_pool.m_entries.
                          super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)miniminer_pool.m_entries.
                                super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)miniminer_pool.m_entries.
                                super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        _Rb_tree<uint256,_std::pair<const_uint256,_node::MiniMinerMempoolEntry>,_std::_Select1st<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
        ::~_Rb_tree(&miniminer_pool.m_entries_by_txid._M_t);
        std::
        _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
        ::~_Rb_tree(&miniminer_pool.m_in_block._M_t);
        std::
        _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
        ::~_Rb_tree(&miniminer_pool.m_bump_fees._M_t);
        std::
        _Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_unsigned_int>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_unsigned_int>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
        ::~_Rb_tree(&miniminer_pool.m_inclusion_order._M_t);
        std::
        _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>_>
        ::~_Rb_tree(&miniminer_pool.m_requested_outpoints_by_txid._M_t);
        std::
        _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
        ::~_Rb_tree(&miniminer_pool.m_to_be_replaced._M_t);
        std::
        _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
        ::~_Rb_tree((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                     *)&descendant_caches);
        std::
        _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>_>
        ::~_Rb_tree(&miniminer_manual.m_descendant_set_by_txid._M_t);
        if (miniminer_manual.m_entries.
            super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(miniminer_manual.m_entries.
                          super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          CONCAT44(miniminer_manual.m_entries.
                                   super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                   miniminer_manual.m_entries.
                                   super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) -
                          (long)miniminer_manual.m_entries.
                                super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        _Rb_tree<uint256,_std::pair<const_uint256,_node::MiniMinerMempoolEntry>,_std::_Select1st<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
        ::~_Rb_tree(&miniminer_manual.m_entries_by_txid._M_t);
        std::
        _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
        ::~_Rb_tree(&miniminer_manual.m_in_block._M_t);
        std::
        _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
        ::~_Rb_tree(&miniminer_manual.m_bump_fees._M_t);
        std::
        _Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_unsigned_int>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_unsigned_int>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
        ::~_Rb_tree(&miniminer_manual.m_inclusion_order._M_t);
        std::
        _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>_>
        ::~_Rb_tree(&miniminer_manual.m_requested_outpoints_by_txid._M_t);
        std::
        _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
        ::~_Rb_tree(&miniminer_manual.m_to_be_replaced._M_t);
        miniminer_manual.m_ready_to_calculate = true;
        miniminer_manual._1_7_ = 0x13;
        CFeeRate::CFeeRate((CFeeRate *)&tx3_bump_fee,(CAmount *)&miniminer_manual,
                           *(uint32_t *)
                            (tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_start + 6));
        local_e30 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_e28 = "";
        local_e40 = &boost::unit_test::basic_cstring<char_const>::null;
        local_e38 = &boost::unit_test::basic_cstring<char_const>::null;
        file_39.m_end = (iterator)0x212;
        file_39.m_begin = (iterator)&local_e30;
        msg_39.m_end = pvVar21;
        msg_39.m_begin = pvVar20;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_e40
                   ,msg_39);
        bump_fees._M_t._M_impl._0_8_ = 0x18894;
        _cVar24 = 0x465c09;
        CFeeRate::CFeeRate((CFeeRate *)&descendant_caches,(CAmount *)&bump_fees,
                           (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_start[7] +
                           (int)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_start[5]);
        miniminer_pool.m_ready_to_calculate =
             tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload._M_value <=
             (long)descendant_caches._M_t._M_impl._0_8_;
        miniminer_pool.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
        mini_miner_tx6_tx7._0_8_ = anon_var_dwarf_d3a891;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ = "";
        miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ =
             miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
        miniminer_manual._0_8_ = &PTR__lazy_ostream_013abc70;
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             boost::unit_test::lazy_ostream::inst;
        local_e50 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_e48 = "";
        pvVar20 = (iterator)0x1;
        pvVar21 = (iterator)0x0;
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&mini_miner_tx6_tx7;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&miniminer_pool,(lazy_ostream *)&miniminer_manual,1,0,WARN,
                   _cVar24,(size_t)&local_e50,0x212);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
        ::node::MiniMiner::MiniMiner(&miniminer_manual,this_00,&all_unspent_outpoints);
        local_e60 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_e58 = "";
        local_e70 = &boost::unit_test::basic_cstring<char_const>::null;
        local_e68 = &boost::unit_test::basic_cstring<char_const>::null;
        _cVar24 = 0x465d0e;
        file_40.m_end = (iterator)0x214;
        file_40.m_begin = (iterator)&local_e60;
        msg_40.m_end = pvVar21;
        msg_40.m_begin = pvVar20;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_e70
                   ,msg_40);
        mini_miner_tx6_tx7.m_ready_to_calculate = miniminer_manual.m_ready_to_calculate;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
        descendant_caches._M_t._M_impl._0_8_ = (long)"!mini_miner.IsReadyToCalculate()" + 1;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = "";
        miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
             miniminer_pool.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
        miniminer_pool._0_8_ = &PTR__lazy_ostream_013abc70;
        miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             boost::unit_test::lazy_ostream::inst;
        local_e80 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_e78 = "";
        pvVar20 = (iterator)0x1;
        pvVar21 = (iterator)0x0;
        miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&descendant_caches;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&mini_miner_tx6_tx7,(lazy_ostream *)&miniminer_pool,1,0,WARN,
                   _cVar24,(size_t)&local_e80,0x214);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
        ::node::MiniMiner::CalculateBumpFees
                  ((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                    *)&miniminer_pool,&miniminer_manual,(CFeeRate *)&tx3_bump_fee);
        local_e90 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_e88 = "";
        local_ea0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_e98 = &boost::unit_test::basic_cstring<char_const>::null;
        _cVar24 = 0x465df9;
        file_41.m_end = (iterator)0x216;
        file_41.m_begin = (iterator)&local_e90;
        msg_41.m_end = pvVar21;
        msg_41.m_begin = pvVar20;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_ea0
                   ,msg_41);
        descendant_caches._M_t._M_impl._0_8_ =
             CONCAT71(descendant_caches._M_t._M_impl._1_7_,miniminer_manual.m_ready_to_calculate) ^
             1;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        bump_fees._M_t._M_impl._0_8_ = anon_var_dwarf_d3a3c4;
        bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = "";
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
             mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
        mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_013abc70;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             boost::unit_test::lazy_ostream::inst;
        local_eb0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_ea8 = "";
        pvVar20 = (iterator)0x1;
        pvVar21 = (iterator)0x0;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&bump_fees;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&descendant_caches,(lazy_ostream *)&mini_miner_tx6_tx7,1,0,
                   WARN,_cVar24,(size_t)&local_eb0,0x216);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
        local_ec0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_eb8 = "";
        local_ed0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_ec8 = &boost::unit_test::basic_cstring<char_const>::null;
        file_42.m_end = (iterator)0x217;
        file_42.m_begin = (iterator)&local_ec0;
        msg_42.m_end = pvVar21;
        msg_42.m_begin = pvVar20;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,(size_t)&local_ed0
                   ,msg_42);
        bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
        bump_fees._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abb30;
        bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
        bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf6cf21;
        tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_payload =
             (_Storage<long,_true>)
             miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
        just_below_tx4.nSatoshisPerK =
             ((long)all_unspent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)all_unspent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2) * -0x71c71c71c71c71c7;
        local_5d0._8_8_ = (element_type *)0x0;
        sStack_5c0.pi_ = (sp_counted_base *)0x0;
        local_c18._0_8_ =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_c18._8_8_ = "";
        local_5b0._0_8_ = &tx6_tx7_bumpfee;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
             mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
        mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_013abb70;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             boost::unit_test::lazy_ostream::inst;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)local_5b0;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
        descendant_caches._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abb70;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)&miniminer_info;
        pvVar20 = (iterator)0x1;
        pvVar21 = (iterator)0x2;
        local_5d0[0] = (class_property<bool>)
                       (class_property<bool>)
                       (miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header
                        ._M_right == (_Base_ptr)just_below_tx4.nSatoshisPerK);
        miniminer_info.
        super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)&just_below_tx4;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_5d0,(lazy_ostream *)&bump_fees,1,2,REQUIRE,0xea3b63,
                   (size_t)local_c18,0x217,&mini_miner_tx6_tx7,"all_unspent_outpoints.size()",
                   (assertion_result *)&descendant_caches);
        boost::detail::shared_count::~shared_count(&sStack_5c0);
        local_ee0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_ed8 = "";
        local_ef0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_ee8 = &boost::unit_test::basic_cstring<char_const>::null;
        file_43.m_end = (iterator)0x218;
        file_43.m_begin = (iterator)&local_ee0;
        msg_43.m_end = pvVar21;
        msg_43.m_begin = pvVar20;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,(size_t)&local_ef0
                   ,msg_43);
        _cVar24 = 0x466066;
        bVar12 = sanity_check(&all_transactions,
                              (map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                               *)&miniminer_pool);
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        bump_fees._M_t._M_impl._0_8_ = anon_var_dwarf_d3a3dd;
        bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             (long)"sanity_check(all_transactions, bump_fees)" + 0x29;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
             mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
        mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_013abc70;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             boost::unit_test::lazy_ostream::inst;
        local_f00 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_ef8 = "";
        pvVar20 = (iterator)0x1;
        pvVar21 = (iterator)0x0;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&bump_fees;
        descendant_caches._M_t._M_impl._0_1_ = bVar12;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&descendant_caches,(lazy_ostream *)&mini_miner_tx6_tx7,1,0,
                   WARN,_cVar24,(size_t)&local_f00,0x218);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
        puVar9 = &((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped;
        mini_miner_tx6_tx7.m_ready_to_calculate =
             (bool)(puVar9->super_base_blob<256U>).m_data._M_elems[0];
        mini_miner_tx6_tx7._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
        mini_miner_tx6_tx7._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
        mini_miner_tx6_tx7._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
        mini_miner_tx6_tx7._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
        mini_miner_tx6_tx7._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
        mini_miner_tx6_tx7._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
        mini_miner_tx6_tx7._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ =
             *(undefined1 (*) [16])
              (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             *(_Base_ptr *)
              (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left.
        _0_4_ = 0;
        iVar16 = std::
                 _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                 ::find((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                         *)&miniminer_pool,(key_type *)&mini_miner_tx6_tx7);
        local_f10 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_f08 = "";
        local_f20 = &boost::unit_test::basic_cstring<char_const>::null;
        local_f18 = &boost::unit_test::basic_cstring<char_const>::null;
        _cVar24 = 0x46617c;
        file_44.m_end = (iterator)0x21a;
        file_44.m_begin = (iterator)&local_f10;
        msg_44.m_end = pvVar21;
        msg_44.m_begin = pvVar20;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,(size_t)&local_f20
                   ,msg_44);
        descendant_caches._M_t._M_impl._0_1_ =
             iVar16._M_node != (_Base_ptr)&miniminer_pool.m_to_be_replaced;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        bump_fees._M_t._M_impl._0_8_ = anon_var_dwarf_d3a755;
        bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = "";
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
             mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
        mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_013abc70;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             boost::unit_test::lazy_ostream::inst;
        local_f30 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_f28 = "";
        pvVar20 = (iterator)0x1;
        pvVar21 = (iterator)0x0;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&bump_fees;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&descendant_caches,(lazy_ostream *)&mini_miner_tx6_tx7,1,0,
                   WARN,_cVar24,(size_t)&local_f30,0x21a);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
        local_f40 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_f38 = "";
        local_f50 = &boost::unit_test::basic_cstring<char_const>::null;
        local_f48 = &boost::unit_test::basic_cstring<char_const>::null;
        file_45.m_end = (iterator)0x21b;
        file_45.m_begin = (iterator)&local_f40;
        msg_45.m_end = pvVar21;
        msg_45.m_begin = pvVar20;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_45,(size_t)&local_f50
                   ,msg_45);
        bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
        bump_fees._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abb30;
        bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
        bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf6cf21;
        CVar17 = CFeeRate::GetFee((CFeeRate *)&tx3_bump_fee,
                                  *(uint32_t *)
                                   (tx_vsizes.super__Vector_base<long,_std::allocator<long>_>.
                                    _M_impl.super__Vector_impl_data._M_start + 6));
        local_5b0._0_8_ = &iVar16._M_node[2]._M_parent;
        tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_payload._M_value = CVar17 + -5000;
        local_5d0[0] = (class_property<bool>)
                       (iVar16._M_node[2]._M_parent ==
                       (_Base_ptr)
                       tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
                       super__Optional_payload_base<long>._M_payload._M_value);
        local_5d0._8_8_ = (element_type *)0x0;
        sStack_5c0.pi_ = (sp_counted_base *)0x0;
        local_c18._0_8_ =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_c18._8_8_ = "";
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
             mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
        mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_013abed0;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             boost::unit_test::lazy_ostream::inst;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)local_5b0;
        miniminer_info.
        super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)&tx6_tx7_bumpfee;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
        descendant_caches._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abed0;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)&miniminer_info;
        pvVar20 = (iterator)0x1;
        pvVar21 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_5d0,(lazy_ostream *)&bump_fees,1,2,REQUIRE,0xea41ed,
                   (size_t)local_c18,0x21b,&mini_miner_tx6_tx7,
                   "just_above_tx6.GetFee(tx_vsizes[6]) - (med_fee)",
                   (assertion_result *)&descendant_caches);
        boost::detail::shared_count::~shared_count(&sStack_5c0);
        puVar9 = &((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped;
        mini_miner_tx6_tx7.m_ready_to_calculate =
             (bool)(puVar9->super_base_blob<256U>).m_data._M_elems[0];
        mini_miner_tx6_tx7._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
        mini_miner_tx6_tx7._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
        mini_miner_tx6_tx7._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
        mini_miner_tx6_tx7._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
        mini_miner_tx6_tx7._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
        mini_miner_tx6_tx7._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
        mini_miner_tx6_tx7._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_16_ =
             *(undefined1 (*) [16])
              (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             *(_Base_ptr *)
              (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left.
        _0_4_ = 0;
        iVar16 = std::
                 _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                 ::find((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                         *)&miniminer_pool,(key_type *)&mini_miner_tx6_tx7);
        local_f60 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_f58 = "";
        local_f70 = &boost::unit_test::basic_cstring<char_const>::null;
        local_f68 = &boost::unit_test::basic_cstring<char_const>::null;
        _cVar24 = 0x466429;
        file_46.m_end = (iterator)0x21d;
        file_46.m_begin = (iterator)&local_f60;
        msg_46.m_end = pvVar21;
        msg_46.m_begin = pvVar20;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_46,(size_t)&local_f70
                   ,msg_46);
        descendant_caches._M_t._M_impl._0_1_ =
             iVar16._M_node != (_Base_ptr)&miniminer_pool.m_to_be_replaced;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        bump_fees._M_t._M_impl._0_8_ = anon_var_dwarf_d3a787;
        bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = "";
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
             mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
        mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_013abc70;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             boost::unit_test::lazy_ostream::inst;
        local_f80 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_f78 = "";
        pvVar20 = (iterator)0x1;
        pvVar21 = (iterator)0x0;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&bump_fees;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&descendant_caches,(lazy_ostream *)&mini_miner_tx6_tx7,1,0,
                   WARN,_cVar24,(size_t)&local_f80,0x21d);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
        local_f90 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_f88 = "";
        local_fa0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_f98 = &boost::unit_test::basic_cstring<char_const>::null;
        file_47.m_end = (iterator)0x21e;
        file_47.m_begin = (iterator)&local_f90;
        msg_47.m_end = pvVar21;
        msg_47.m_begin = pvVar20;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_47,(size_t)&local_fa0
                   ,msg_47);
        bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
        bump_fees._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abb30;
        bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
        bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf6cf21;
        local_5b0._0_8_ = &iVar16._M_node[2]._M_parent;
        tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_payload._M_value =
             tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload._M_value & 0xffffffff00000000;
        local_5d0[0] = (class_property<bool>)
                       (class_property<bool>)(iVar16._M_node[2]._M_parent == (_Base_ptr)0x0);
        local_5d0._8_8_ = (element_type *)0x0;
        sStack_5c0.pi_ = (sp_counted_base *)0x0;
        local_c18._0_8_ =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_c18._8_8_ = (element_type *)0xea3807;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
             mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
        mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_013abed0;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             boost::unit_test::lazy_ostream::inst;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)local_5b0;
        miniminer_info.
        super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)&tx6_tx7_bumpfee;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
        descendant_caches._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abcf0;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)&miniminer_info;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_5d0,(lazy_ostream *)&bump_fees,1,2,REQUIRE,0xea4286,
                   (size_t)local_c18,0x21e,&mini_miner_tx6_tx7,"0",
                   (assertion_result *)&descendant_caches);
        boost::detail::shared_count::~shared_count(&sStack_5c0);
        std::
        _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
        ::~_Rb_tree((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                     *)&miniminer_pool);
        std::
        _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>_>
        ::~_Rb_tree(&miniminer_manual.m_descendant_set_by_txid._M_t);
        if (miniminer_manual.m_entries.
            super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(miniminer_manual.m_entries.
                          super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          CONCAT44(miniminer_manual.m_entries.
                                   super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                   miniminer_manual.m_entries.
                                   super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) -
                          (long)miniminer_manual.m_entries.
                                super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        _Rb_tree<uint256,_std::pair<const_uint256,_node::MiniMinerMempoolEntry>,_std::_Select1st<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
        ::~_Rb_tree(&miniminer_manual.m_entries_by_txid._M_t);
        std::
        _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
        ::~_Rb_tree(&miniminer_manual.m_in_block._M_t);
        std::
        _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
        ::~_Rb_tree(&miniminer_manual.m_bump_fees._M_t);
        std::
        _Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_unsigned_int>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_unsigned_int>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
        ::~_Rb_tree(&miniminer_manual.m_inclusion_order._M_t);
        std::
        _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>_>
        ::~_Rb_tree(&miniminer_manual.m_requested_outpoints_by_txid._M_t);
        std::
        _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
        ::~_Rb_tree(&miniminer_manual.m_to_be_replaced._M_t);
        miniminer_info.
        super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        miniminer_info.
        super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        miniminer_info.
        super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
        emplace_back<std::shared_ptr<CTransaction_const>const&,long&,long&,long_const&,long_const&>
                  ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>
                    *)&miniminer_info,&tx0,
                   tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start,&low_fee,&low_fee);
        std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
        emplace_back<std::shared_ptr<CTransaction_const>const&,long&,long&,long_const&,long_const&>
                  ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>
                    *)&miniminer_info,&tx1,
                   tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start + 1,
                   tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start + 1,&med_fee,&med_fee);
        std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
        emplace_back<std::shared_ptr<CTransaction_const>const&,long&,long&,long_const&,long_const&>
                  ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>
                    *)&miniminer_info,&tx2,
                   tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start + 2,
                   tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start + 2,&high_fee,&high_fee);
        miniminer_manual._0_8_ =
             tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start[3] +
             tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start[1] +
             tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start[2] +
             *tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start;
        miniminer_pool.m_ready_to_calculate = true;
        miniminer_pool._1_7_ = 0x322;
        std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
        emplace_back<std::shared_ptr<CTransaction_const>const&,long&,long,long_const&,long>
                  ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>
                    *)&miniminer_info,&tx3,
                   tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start + 3,(long *)&miniminer_manual,&high_fee,
                   (long *)&miniminer_pool);
        std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
        emplace_back<std::shared_ptr<CTransaction_const>const&,long&,long&,long_const&,long_const&>
                  ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>
                    *)&miniminer_info,&tx4,
                   tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start + 4,
                   tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start + 4,&high_fee,&high_fee);
        miniminer_manual._0_8_ =
             tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start[5] +
             tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start[4];
        miniminer_pool.m_ready_to_calculate = true;
        miniminer_pool._1_7_ = 0x188;
        std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
        emplace_back<std::shared_ptr<CTransaction_const>const&,long&,long,long_const&,long>
                  ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>
                    *)&miniminer_info,&tx5,
                   tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start + 5,(long *)&miniminer_manual,&low_fee,
                   (long *)&miniminer_pool);
        miniminer_manual._0_8_ =
             tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start[5] +
             tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start[4] +
             tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start[6];
        miniminer_pool.m_ready_to_calculate = true;
        miniminer_pool._1_7_ = 0x19c;
        std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
        emplace_back<std::shared_ptr<CTransaction_const>const&,long&,long,long_const&,long>
                  ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>
                    *)&miniminer_info,&tx6,
                   tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start + 6,(long *)&miniminer_manual,&med_fee,
                   (long *)&miniminer_pool);
        miniminer_manual._0_8_ =
             tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start[5] +
             tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start[4] +
             tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start[7];
        __args_4 = &miniminer_pool;
        miniminer_pool.m_ready_to_calculate = true;
        miniminer_pool._1_7_ = 0x30f;
        std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
        emplace_back<std::shared_ptr<CTransaction_const>const&,long&,long,long_const&,long>
                  ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>
                    *)&miniminer_info,&tx7,
                   tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start + 7,(long *)&miniminer_manual,&high_fee,
                   (long *)__args_4);
        peVar2 = tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._4_8_ << 0x20;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
        puVar9 = &((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped;
        miniminer_manual.m_ready_to_calculate =
             (bool)(puVar9->super_base_blob<256U>).m_data._M_elems[0];
        miniminer_manual._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
        miniminer_manual._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
        miniminer_manual._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
        miniminer_manual._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
        miniminer_manual._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
        miniminer_manual._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
        miniminer_manual._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
        pbVar10 = &((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->hash).m_wrapped.super_base_blob<256U>;
        miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar10->m_data)._M_elems[8];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar10->m_data)._M_elems[9];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar10->m_data)._M_elems[10];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar10->m_data)._M_elems[0xb];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar10->m_data)._M_elems[0xc];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar10->m_data)._M_elems[0xd];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar10->m_data)._M_elems[0xe];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar10->m_data)._M_elems[0xf];
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             *(undefined8 *)
              (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             *(_Base_ptr *)
              (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        uVar5 = *(undefined8 *)
                 ((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        uVar6 = *(undefined8 *)
                 (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        uVar7 = *(undefined8 *)
                 (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        uVar8 = *(undefined8 *)
                 (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_
             = (undefined4)uVar5;
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_
             = (undefined4)((ulong)uVar5 >> 0x20);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right.
        _0_4_ = (undefined4)uVar6;
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right.
        _4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
             (undefined4)uVar7;
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
             (undefined4)((ulong)uVar7 >> 0x20);
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = SUB84(uVar8,0);
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ =
             SUB84((ulong)uVar8 >> 0x20,0);
        __l_12._M_len = 2;
        __l_12._M_array = (iterator)&miniminer_manual;
        descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        std::
        set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
        ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
               *)&miniminer_pool,__l_12,(less<transaction_identifier<false>_> *)&mini_miner_tx6_tx7,
              (allocator_type *)&bump_fees);
        std::
        _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
        ::
        _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                  ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                    *)&descendant_caches,&peVar2->hash,
                   (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                    *)&miniminer_pool);
        std::
        _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
        ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                     *)&miniminer_pool);
        peVar2 = tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        puVar9 = &((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped;
        miniminer_manual.m_ready_to_calculate =
             (bool)(puVar9->super_base_blob<256U>).m_data._M_elems[0];
        miniminer_manual._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
        miniminer_manual._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
        miniminer_manual._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
        miniminer_manual._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
        miniminer_manual._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
        miniminer_manual._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
        miniminer_manual._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
        pbVar10 = &((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->hash).m_wrapped.super_base_blob<256U>;
        miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar10->m_data)._M_elems[8];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar10->m_data)._M_elems[9];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar10->m_data)._M_elems[10];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar10->m_data)._M_elems[0xb];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar10->m_data)._M_elems[0xc];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar10->m_data)._M_elems[0xd];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar10->m_data)._M_elems[0xe];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar10->m_data)._M_elems[0xf];
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             *(undefined8 *)
              (((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             *(_Base_ptr *)
              (((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        uVar5 = *(undefined8 *)
                 ((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        uVar6 = *(undefined8 *)
                 (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        uVar7 = *(undefined8 *)
                 (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        uVar8 = *(undefined8 *)
                 (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_
             = (undefined4)uVar5;
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_
             = (undefined4)((ulong)uVar5 >> 0x20);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right.
        _0_4_ = (undefined4)uVar6;
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right.
        _4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
             (undefined4)uVar7;
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
             (undefined4)((ulong)uVar7 >> 0x20);
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = SUB84(uVar8,0);
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ =
             SUB84((ulong)uVar8 >> 0x20,0);
        __l_13._M_len = 2;
        __l_13._M_array = (iterator)&miniminer_manual;
        std::
        set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
        ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
               *)&miniminer_pool,__l_13,(less<transaction_identifier<false>_> *)&mini_miner_tx6_tx7,
              (allocator_type *)&bump_fees);
        std::
        _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
        ::
        _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                  ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                    *)&descendant_caches,&peVar2->hash,
                   (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                    *)&miniminer_pool);
        std::
        _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
        ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                     *)&miniminer_pool);
        peVar2 = tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        puVar9 = &((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped;
        miniminer_manual.m_ready_to_calculate =
             (bool)(puVar9->super_base_blob<256U>).m_data._M_elems[0];
        miniminer_manual._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
        miniminer_manual._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
        miniminer_manual._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
        miniminer_manual._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
        miniminer_manual._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
        miniminer_manual._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
        miniminer_manual._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
        pbVar10 = &((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->hash).m_wrapped.super_base_blob<256U>;
        miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar10->m_data)._M_elems[8];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar10->m_data)._M_elems[9];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar10->m_data)._M_elems[10];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar10->m_data)._M_elems[0xb];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar10->m_data)._M_elems[0xc];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar10->m_data)._M_elems[0xd];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar10->m_data)._M_elems[0xe];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar10->m_data)._M_elems[0xf];
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             *(undefined8 *)
              (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             *(_Base_ptr *)
              (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        uVar5 = *(undefined8 *)
                 ((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        uVar6 = *(undefined8 *)
                 (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        uVar7 = *(undefined8 *)
                 (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        uVar8 = *(undefined8 *)
                 (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_
             = (undefined4)uVar5;
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_
             = (undefined4)((ulong)uVar5 >> 0x20);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right.
        _0_4_ = (undefined4)uVar6;
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right.
        _4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
             (undefined4)uVar7;
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
             (undefined4)((ulong)uVar7 >> 0x20);
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = SUB84(uVar8,0);
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ =
             SUB84((ulong)uVar8 >> 0x20,0);
        __l_14._M_len = 2;
        __l_14._M_array = (iterator)&miniminer_manual;
        std::
        set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
        ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
               *)&miniminer_pool,__l_14,(less<transaction_identifier<false>_> *)&mini_miner_tx6_tx7,
              (allocator_type *)&bump_fees);
        std::
        _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
        ::
        _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                  ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                    *)&descendant_caches,&peVar2->hash,
                   (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                    *)&miniminer_pool);
        std::
        _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
        ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                     *)&miniminer_pool);
        peVar2 = tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        puVar9 = &((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped;
        miniminer_pool.m_ready_to_calculate =
             (bool)(puVar9->super_base_blob<256U>).m_data._M_elems[0];
        miniminer_pool._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
        miniminer_pool._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
        miniminer_pool._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
        miniminer_pool._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
        miniminer_pool._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
        miniminer_pool._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
        miniminer_pool._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
        miniminer_pool.m_to_be_replaced._M_t._M_impl._0_16_ =
             *(undefined1 (*) [16])
              (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             *(_Base_ptr *)
              (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        __l_15._M_len = 1;
        __l_15._M_array = (iterator)&miniminer_pool;
        std::
        set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
        ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
               *)&miniminer_manual,__l_15,
              (less<transaction_identifier<false>_> *)&mini_miner_tx6_tx7,
              (allocator_type *)&bump_fees);
        std::
        _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
        ::
        _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                  ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                    *)&descendant_caches,&peVar2->hash,
                   (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                    *)&miniminer_manual);
        std::
        _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
        ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                     *)&miniminer_manual);
        peVar2 = tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        puVar9 = &((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped;
        miniminer_manual.m_ready_to_calculate =
             (bool)(puVar9->super_base_blob<256U>).m_data._M_elems[0];
        miniminer_manual._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
        miniminer_manual._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
        miniminer_manual._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
        miniminer_manual._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
        miniminer_manual._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
        miniminer_manual._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
        miniminer_manual._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
        pbVar10 = &((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->hash).m_wrapped.super_base_blob<256U>;
        miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar10->m_data)._M_elems[8];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar10->m_data)._M_elems[9];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar10->m_data)._M_elems[10];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar10->m_data)._M_elems[0xb];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar10->m_data)._M_elems[0xc];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar10->m_data)._M_elems[0xd];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar10->m_data)._M_elems[0xe];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar10->m_data)._M_elems[0xf];
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             *(undefined8 *)
              (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             *(_Base_ptr *)
              (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        uVar5 = *(undefined8 *)
                 ((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        uVar6 = *(undefined8 *)
                 (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        uVar7 = *(undefined8 *)
                 (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        uVar8 = *(undefined8 *)
                 (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
             (undefined4)uVar7;
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
             (undefined4)((ulong)uVar7 >> 0x20);
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = SUB84(uVar8,0);
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ =
             SUB84((ulong)uVar8 >> 0x20,0);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_
             = (undefined4)uVar5;
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_
             = (undefined4)((ulong)uVar5 >> 0x20);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right.
        _0_4_ = (undefined4)uVar6;
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right.
        _4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
        uVar5 = *(undefined8 *)
                 ((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
        _M_parent = *(_Base_ptr *)
                     (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
        _M_left = *(_Base_ptr *)
                   (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
        _M_right = *(_Base_ptr *)
                    (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      )->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
        _M_color = (_Rb_tree_color)uVar5;
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
        _4_4_ = SUB84((ulong)uVar5 >> 0x20,0);
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header.
        _M_node_count =
             *(size_t *)
              ((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash
              ).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        uVar5 = *(undefined8 *)
                 (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        uVar6 = *(undefined8 *)
                 (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        uVar7 = *(undefined8 *)
                 (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             (_Rb_tree_color)uVar6;
        miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
             SUB84((ulong)uVar6 >> 0x20,0);
        miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_parent.
        _0_4_ = (undefined4)uVar7;
        miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_parent.
        _4_4_ = (undefined4)((ulong)uVar7 >> 0x20);
        miniminer_manual.m_inclusion_order._M_t._M_impl._0_4_ = SUB84(uVar5,0);
        miniminer_manual.m_inclusion_order._M_t._M_impl._4_4_ = SUB84((ulong)uVar5 >> 0x20,0);
        __l_16._M_len = 4;
        __l_16._M_array = (iterator)&miniminer_manual;
        std::
        set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
        ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
               *)&miniminer_pool,__l_16,(less<transaction_identifier<false>_> *)&mini_miner_tx6_tx7,
              (allocator_type *)&bump_fees);
        std::
        _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
        ::
        _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                  ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                    *)&descendant_caches,&peVar2->hash,
                   (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                    *)&miniminer_pool);
        std::
        _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
        ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                     *)&miniminer_pool);
        peVar2 = tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        puVar9 = &((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped;
        miniminer_manual.m_ready_to_calculate =
             (bool)(puVar9->super_base_blob<256U>).m_data._M_elems[0];
        miniminer_manual._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
        miniminer_manual._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
        miniminer_manual._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
        miniminer_manual._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
        miniminer_manual._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
        miniminer_manual._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
        miniminer_manual._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
        pbVar10 = &((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->hash).m_wrapped.super_base_blob<256U>;
        miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar10->m_data)._M_elems[8];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar10->m_data)._M_elems[9];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar10->m_data)._M_elems[10];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar10->m_data)._M_elems[0xb];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar10->m_data)._M_elems[0xc];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar10->m_data)._M_elems[0xd];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar10->m_data)._M_elems[0xe];
        miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar10->m_data)._M_elems[0xf];
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             *(undefined8 *)
              (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             *(_Base_ptr *)
              (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        uVar5 = *(undefined8 *)
                 ((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        uVar6 = *(undefined8 *)
                 (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        uVar7 = *(undefined8 *)
                 (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        uVar8 = *(undefined8 *)
                 (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_
             = (undefined4)uVar5;
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_
             = (undefined4)((ulong)uVar5 >> 0x20);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right.
        _0_4_ = (undefined4)uVar6;
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right.
        _4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
             (undefined4)uVar7;
        miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
             (undefined4)((ulong)uVar7 >> 0x20);
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = SUB84(uVar8,0);
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ =
             SUB84((ulong)uVar8 >> 0x20,0);
        uVar5 = *(undefined8 *)
                 ((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
        _M_parent = *(_Base_ptr *)
                     (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
        _M_left = *(_Base_ptr *)
                   (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
        _M_right = *(_Base_ptr *)
                    (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      )->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
        _M_color = (_Rb_tree_color)uVar5;
        miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
        _4_4_ = SUB84((ulong)uVar5 >> 0x20,0);
        __l_17._M_len = 3;
        __l_17._M_array = (iterator)&miniminer_manual;
        std::
        set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
        ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
               *)&miniminer_pool,__l_17,(less<transaction_identifier<false>_> *)&mini_miner_tx6_tx7,
              (allocator_type *)&bump_fees);
        std::
        _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
        ::
        _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                  ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                    *)&descendant_caches,&peVar2->hash,
                   (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                    *)&miniminer_pool);
        std::
        _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
        ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                     *)&miniminer_pool);
        peVar2 = tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        puVar9 = &((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped;
        miniminer_pool.m_ready_to_calculate =
             (bool)(puVar9->super_base_blob<256U>).m_data._M_elems[0];
        miniminer_pool._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
        miniminer_pool._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
        miniminer_pool._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
        miniminer_pool._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
        miniminer_pool._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
        miniminer_pool._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
        miniminer_pool._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
        miniminer_pool.m_to_be_replaced._M_t._M_impl._0_16_ =
             *(undefined1 (*) [16])
              (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             *(_Base_ptr *)
              (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        __l_18._M_len = 1;
        __l_18._M_array = (iterator)&miniminer_pool;
        std::
        set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
        ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
               *)&miniminer_manual,__l_18,
              (less<transaction_identifier<false>_> *)&mini_miner_tx6_tx7,
              (allocator_type *)&bump_fees);
        std::
        _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
        ::
        _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                  ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                    *)&descendant_caches,&peVar2->hash,
                   (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                    *)&miniminer_manual);
        std::
        _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
        ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                     *)&miniminer_manual);
        peVar2 = tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        puVar9 = &((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped;
        miniminer_pool.m_ready_to_calculate =
             (bool)(puVar9->super_base_blob<256U>).m_data._M_elems[0];
        miniminer_pool._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
        miniminer_pool._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
        miniminer_pool._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
        miniminer_pool._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
        miniminer_pool._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
        miniminer_pool._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
        miniminer_pool._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
        miniminer_pool.m_to_be_replaced._M_t._M_impl._0_16_ =
             *(undefined1 (*) [16])
              (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             *(_Base_ptr *)
              (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        __a = (allocator_type *)&bump_fees;
        __l_19._M_len = 1;
        __l_19._M_array = (iterator)&miniminer_pool;
        std::
        set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
        ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
               *)&miniminer_manual,__l_19,
              (less<transaction_identifier<false>_> *)&mini_miner_tx6_tx7,__a);
        std::
        _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
        ::
        _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                  ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                    *)&descendant_caches,&peVar2->hash,
                   (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                    *)&miniminer_manual);
        std::
        _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
        ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                     *)&miniminer_manual);
        ::node::MiniMiner::MiniMiner(&miniminer_manual,&miniminer_info,&descendant_caches);
        ::node::MiniMiner::MiniMiner(&miniminer_pool,this_00,&all_unspent_outpoints);
        local_fb0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_fa8 = "";
        local_fc0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_fb8 = &boost::unit_test::basic_cstring<char_const>::null;
        _cVar24 = 0x466da7;
        file_48.m_end = (iterator)0x238;
        file_48.m_begin = (iterator)&local_fb0;
        msg_48.m_end = &__args_4->m_ready_to_calculate;
        msg_48.m_begin = (iterator)__a;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_48,(size_t)&local_fc0
                   ,msg_48);
        bump_fees._M_t._M_impl._0_1_ = miniminer_manual.m_ready_to_calculate;
        bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_5d0._0_8_ = "miniminer_manual.IsReadyToCalculate()";
        local_5d0._8_8_ = "";
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
             mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
        mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_013abc70;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             boost::unit_test::lazy_ostream::inst;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)local_5d0;
        local_fd0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_fc8 = "";
        pvVar20 = (iterator)0x1;
        pvVar21 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&bump_fees,(lazy_ostream *)&mini_miner_tx6_tx7,1,0,WARN,
                   _cVar24,(size_t)&local_fd0,0x238);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)&bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                  );
        local_fe0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_fd8 = "";
        local_ff0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_fe8 = &boost::unit_test::basic_cstring<char_const>::null;
        _cVar24 = 0x466e76;
        file_49.m_end = (iterator)0x239;
        file_49.m_begin = (iterator)&local_fe0;
        msg_49.m_end = pvVar21;
        msg_49.m_begin = pvVar20;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_49,(size_t)&local_ff0
                   ,msg_49);
        bump_fees._M_t._M_impl._0_1_ = miniminer_pool.m_ready_to_calculate;
        bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_5d0._0_8_ = "miniminer_pool.IsReadyToCalculate()";
        local_5d0._8_8_ = (element_type *)0xea3da7;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._0_8_ =
             mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl._1_8_ << 8;
        mini_miner_tx6_tx7._0_8_ = &PTR__lazy_ostream_013abc70;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             boost::unit_test::lazy_ostream::inst;
        mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)local_5d0;
        local_1000 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_ff8 = "";
        pvVar20 = (iterator)0x1;
        pvVar21 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&bump_fees,(lazy_ostream *)&mini_miner_tx6_tx7,1,0,WARN,
                   _cVar24,(size_t)&local_1000,0x239);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)&bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                  );
        ::node::MiniMiner::Linearize
                  ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                    *)&mini_miner_tx6_tx7,&miniminer_manual);
        ::node::MiniMiner::Linearize
                  ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                    *)&mini_miner_tx6_tx7.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count,&miniminer_pool);
        lVar18 = 0;
        do {
          local_1010 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_1008 = "";
          local_1020 = &boost::unit_test::basic_cstring<char_const>::null;
          local_1018 = &boost::unit_test::basic_cstring<char_const>::null;
          file_50.m_end = (iterator)0x23c;
          file_50.m_begin = (iterator)&local_1010;
          msg_50.m_end = pvVar21;
          msg_50.m_begin = pvVar20;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_50,
                     (size_t)&local_1020,msg_50);
          map = &mini_miner_tx6_tx7.m_ready_to_calculate + lVar18;
          local_c18._8_8_ = local_c18._9_8_ << 8;
          local_c18._0_8_ = &PTR__lazy_ostream_013abb30;
          sStack_c08.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_c00 = (_Base_ptr)0xf6cf21;
          _Var13 = Find<transaction_identifier<false>,unsigned_int>
                             ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                               *)map,&(tx4.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->hash);
          very_high_feerate.nSatoshisPerK = very_high_feerate.nSatoshisPerK & 0xffffffff00000000;
          local_5b0._8_8_ = (element_type *)0x0;
          sStack_5a0.pi_ = (sp_counted_base *)0x0;
          tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value = (long)anon_var_dwarf_d30e50;
          tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._8_8_ =
               (long)
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
               + 0x68;
          tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value = (long)local_5e0;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
          bump_fees._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abbb0;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)boost::unit_test::lazy_ostream::inst;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)&tx6_tx7_bumpfee;
          just_below_tx4.nSatoshisPerK = (CAmount)&very_high_feerate;
          local_5d0._8_8_ = local_5d0._9_8_ << 8;
          local_5d0._0_8_ = &PTR__lazy_ostream_013abcf0;
          sStack_5c0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_5b8 = (_Base_ptr)&just_below_tx4;
          pvVar20 = (iterator)0x1;
          pvVar21 = (iterator)0x2;
          local_5e0._0_4_ = _Var13;
          local_5b0[0] = (class_property<bool>)(class_property<bool>)(_Var13 == _S_red);
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_5b0,(lazy_ostream *)local_c18,1,2,REQUIRE,0xea3e08,
                     (size_t)&tx3_bump_fee,0x23c,&bump_fees,"0",local_5d0);
          boost::detail::shared_count::~shared_count(&sStack_5a0);
          local_1030 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_1028 = "";
          local_1040 = &boost::unit_test::basic_cstring<char_const>::null;
          local_1038 = &boost::unit_test::basic_cstring<char_const>::null;
          file_51.m_end = (iterator)0x23d;
          file_51.m_begin = (iterator)&local_1030;
          msg_51.m_end = pvVar21;
          msg_51.m_begin = pvVar20;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_51,
                     (size_t)&local_1040,msg_51);
          local_c18._8_8_ = local_c18._9_8_ << 8;
          local_c18._0_8_ = &PTR__lazy_ostream_013abb30;
          sStack_c08.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_c00 = (_Base_ptr)0xf6cf21;
          local_5e0._0_4_ =
               Find<transaction_identifier<false>,unsigned_int>
                         ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                           *)map,&(tx2.
                                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->hash);
          very_high_feerate.nSatoshisPerK._0_4_ = 1;
          local_5b0[0] = (class_property<bool>)(local_5e0._0_4_ == _S_black);
          local_5b0._8_8_ = (element_type *)0x0;
          sStack_5a0.pi_ = (sp_counted_base *)0x0;
          tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value = (long)anon_var_dwarf_d30e50;
          tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._8_8_ =
               (long)
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
               + 0x68;
          tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value = (long)local_5e0;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
          bump_fees._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abbb0;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)boost::unit_test::lazy_ostream::inst;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)&tx6_tx7_bumpfee;
          just_below_tx4.nSatoshisPerK = (CAmount)&very_high_feerate;
          local_5d0._8_8_ = local_5d0._9_8_ << 8;
          local_5d0._0_8_ = &PTR__lazy_ostream_013abcf0;
          sStack_5c0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_5b8 = (_Base_ptr)&just_below_tx4;
          pvVar20 = (iterator)0x1;
          pvVar21 = (iterator)0x2;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_5b0,(lazy_ostream *)local_c18,1,2,REQUIRE,0xea3dc8,
                     (size_t)&tx3_bump_fee,0x23d,&bump_fees,"1",local_5d0);
          boost::detail::shared_count::~shared_count(&sStack_5a0);
          local_1050 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_1048 = "";
          local_1060 = &boost::unit_test::basic_cstring<char_const>::null;
          local_1058 = &boost::unit_test::basic_cstring<char_const>::null;
          file_52.m_end = (iterator)0x240;
          file_52.m_begin = (iterator)&local_1050;
          msg_52.m_end = pvVar21;
          msg_52.m_begin = pvVar20;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_52,
                     (size_t)&local_1060,msg_52);
          local_c18._8_8_ = local_c18._9_8_ << 8;
          local_c18._0_8_ = &PTR__lazy_ostream_013abb30;
          sStack_c08.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_c00 = (_Base_ptr)0xf6cf21;
          local_5e0._0_4_ =
               Find<transaction_identifier<false>,unsigned_int>
                         ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                           *)map,&(tx5.
                                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->hash);
          very_high_feerate.nSatoshisPerK._0_4_ = 2;
          local_5b0[0] = (class_property<bool>)(local_5e0._0_4_ == 2);
          local_5b0._8_8_ = (element_type *)0x0;
          sStack_5a0.pi_ = (sp_counted_base *)0x0;
          tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value = (long)anon_var_dwarf_d30e50;
          tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._8_8_ =
               (long)
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
               + 0x68;
          tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value = (long)local_5e0;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
          bump_fees._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abbb0;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)boost::unit_test::lazy_ostream::inst;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)&tx6_tx7_bumpfee;
          just_below_tx4.nSatoshisPerK = (CAmount)&very_high_feerate;
          local_5d0._8_8_ = local_5d0._9_8_ << 8;
          local_5d0._0_8_ = &PTR__lazy_ostream_013abcf0;
          sStack_5c0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_5b8 = (_Base_ptr)&just_below_tx4;
          pvVar20 = (iterator)0x1;
          pvVar21 = (iterator)0x2;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_5b0,(lazy_ostream *)local_c18,1,2,REQUIRE,0xea3e28,
                     (size_t)&tx3_bump_fee,0x240,&bump_fees,"2",local_5d0);
          boost::detail::shared_count::~shared_count(&sStack_5a0);
          local_1070 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_1068 = "";
          local_1080 = &boost::unit_test::basic_cstring<char_const>::null;
          local_1078 = &boost::unit_test::basic_cstring<char_const>::null;
          file_53.m_end = (iterator)0x241;
          file_53.m_begin = (iterator)&local_1070;
          msg_53.m_end = pvVar21;
          msg_53.m_begin = pvVar20;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_53,
                     (size_t)&local_1080,msg_53);
          local_c18._8_8_ = local_c18._9_8_ << 8;
          local_c18._0_8_ = &PTR__lazy_ostream_013abb30;
          sStack_c08.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_c00 = (_Base_ptr)0xf6cf21;
          local_5e0._0_4_ =
               Find<transaction_identifier<false>,unsigned_int>
                         ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                           *)map,&(tx7.
                                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->hash);
          very_high_feerate.nSatoshisPerK._0_4_ = 2;
          local_5b0[0] = (class_property<bool>)(local_5e0._0_4_ == 2);
          local_5b0._8_8_ = (element_type *)0x0;
          sStack_5a0.pi_ = (sp_counted_base *)0x0;
          tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value = (long)anon_var_dwarf_d30e50;
          tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._8_8_ =
               (long)
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
               + 0x68;
          tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value = (long)local_5e0;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
          bump_fees._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abbb0;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)boost::unit_test::lazy_ostream::inst;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)&tx6_tx7_bumpfee;
          just_below_tx4.nSatoshisPerK = (CAmount)&very_high_feerate;
          local_5d0._8_8_ = local_5d0._9_8_ << 8;
          local_5d0._0_8_ = &PTR__lazy_ostream_013abcf0;
          sStack_5c0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_5b8 = (_Base_ptr)&just_below_tx4;
          pvVar20 = (iterator)0x1;
          pvVar21 = (iterator)0x2;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_5b0,(lazy_ostream *)local_c18,1,2,REQUIRE,0xea3e88,
                     (size_t)&tx3_bump_fee,0x241,&bump_fees,"2",local_5d0);
          boost::detail::shared_count::~shared_count(&sStack_5a0);
          local_1090 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_1088 = "";
          local_10a0 = &boost::unit_test::basic_cstring<char_const>::null;
          local_1098 = &boost::unit_test::basic_cstring<char_const>::null;
          file_54.m_end = (iterator)0x244;
          file_54.m_begin = (iterator)&local_1090;
          msg_54.m_end = pvVar21;
          msg_54.m_begin = pvVar20;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_54,
                     (size_t)&local_10a0,msg_54);
          local_c18._8_8_ = local_c18._9_8_ << 8;
          local_c18._0_8_ = &PTR__lazy_ostream_013abb30;
          sStack_c08.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_c00 = (_Base_ptr)0xf6cf21;
          local_5e0._0_4_ =
               Find<transaction_identifier<false>,unsigned_int>
                         ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                           *)map,&(tx0.
                                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->hash);
          very_high_feerate.nSatoshisPerK._0_4_ = 3;
          local_5b0[0] = (class_property<bool>)(local_5e0._0_4_ == 3);
          local_5b0._8_8_ = (element_type *)0x0;
          sStack_5a0.pi_ = (sp_counted_base *)0x0;
          tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value = (long)anon_var_dwarf_d30e50;
          tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._8_8_ =
               (long)
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
               + 0x68;
          tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value = (long)local_5e0;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
          bump_fees._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abbb0;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)boost::unit_test::lazy_ostream::inst;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)&tx6_tx7_bumpfee;
          just_below_tx4.nSatoshisPerK = (CAmount)&very_high_feerate;
          local_5d0._8_8_ = local_5d0._9_8_ << 8;
          local_5d0._0_8_ = &PTR__lazy_ostream_013abcf0;
          sStack_5c0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_5b8 = (_Base_ptr)&just_below_tx4;
          pvVar20 = (iterator)0x1;
          pvVar21 = (iterator)0x2;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_5b0,(lazy_ostream *)local_c18,1,2,REQUIRE,0xea3e48,
                     (size_t)&tx3_bump_fee,0x244,&bump_fees,"3",local_5d0);
          boost::detail::shared_count::~shared_count(&sStack_5a0);
          local_10b0 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_10a8 = "";
          local_10c0 = &boost::unit_test::basic_cstring<char_const>::null;
          local_10b8 = &boost::unit_test::basic_cstring<char_const>::null;
          file_55.m_end = (iterator)0x245;
          file_55.m_begin = (iterator)&local_10b0;
          msg_55.m_end = pvVar21;
          msg_55.m_begin = pvVar20;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_55,
                     (size_t)&local_10c0,msg_55);
          local_c18._8_8_ = local_c18._9_8_ << 8;
          local_c18._0_8_ = &PTR__lazy_ostream_013abb30;
          sStack_c08.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_c00 = (_Base_ptr)0xf6cf21;
          local_5e0._0_4_ =
               Find<transaction_identifier<false>,unsigned_int>
                         ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                           *)map,&(tx1.
                                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->hash);
          very_high_feerate.nSatoshisPerK._0_4_ = 3;
          local_5b0[0] = (class_property<bool>)(local_5e0._0_4_ == 3);
          local_5b0._8_8_ = (element_type *)0x0;
          sStack_5a0.pi_ = (sp_counted_base *)0x0;
          tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value = (long)anon_var_dwarf_d30e50;
          tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._8_8_ =
               (long)
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
               + 0x68;
          tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value = (long)local_5e0;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
          bump_fees._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abbb0;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)boost::unit_test::lazy_ostream::inst;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)&tx6_tx7_bumpfee;
          just_below_tx4.nSatoshisPerK = (CAmount)&very_high_feerate;
          local_5d0._8_8_ = local_5d0._9_8_ << 8;
          local_5d0._0_8_ = &PTR__lazy_ostream_013abcf0;
          sStack_5c0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_5b8 = (_Base_ptr)&just_below_tx4;
          pvVar20 = (iterator)0x1;
          pvVar21 = (iterator)0x2;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_5b0,(lazy_ostream *)local_c18,1,2,REQUIRE,0xea3e68,
                     (size_t)&tx3_bump_fee,0x245,&bump_fees,"3",local_5d0);
          boost::detail::shared_count::~shared_count(&sStack_5a0);
          local_10d0 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_10c8 = "";
          local_10e0 = &boost::unit_test::basic_cstring<char_const>::null;
          local_10d8 = &boost::unit_test::basic_cstring<char_const>::null;
          file_56.m_end = (iterator)0x246;
          file_56.m_begin = (iterator)&local_10d0;
          msg_56.m_end = pvVar21;
          msg_56.m_begin = pvVar20;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_56,
                     (size_t)&local_10e0,msg_56);
          local_c18._8_8_ = local_c18._9_8_ << 8;
          local_c18._0_8_ = &PTR__lazy_ostream_013abb30;
          sStack_c08.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_c00 = (_Base_ptr)0xf6cf21;
          local_5e0._0_4_ =
               Find<transaction_identifier<false>,unsigned_int>
                         ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                           *)map,&(tx3.
                                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->hash);
          very_high_feerate.nSatoshisPerK._0_4_ = 3;
          local_5b0[0] = (class_property<bool>)(local_5e0._0_4_ == 3);
          local_5b0._8_8_ = (element_type *)0x0;
          sStack_5a0.pi_ = (sp_counted_base *)0x0;
          tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value = (long)anon_var_dwarf_d30e50;
          tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._8_8_ =
               (long)
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
               + 0x68;
          tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value = (long)local_5e0;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
          bump_fees._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abbb0;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)boost::unit_test::lazy_ostream::inst;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)&tx6_tx7_bumpfee;
          just_below_tx4.nSatoshisPerK = (CAmount)&very_high_feerate;
          local_5d0._8_8_ = local_5d0._9_8_ << 8;
          local_5d0._0_8_ = &PTR__lazy_ostream_013abcf0;
          sStack_5c0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_5b8 = (_Base_ptr)&just_below_tx4;
          pvVar20 = (iterator)0x1;
          pvVar21 = (iterator)0x2;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_5b0,(lazy_ostream *)local_c18,1,2,REQUIRE,0xea3de8,
                     (size_t)&tx3_bump_fee,0x246,&bump_fees,"3",local_5d0);
          boost::detail::shared_count::~shared_count(&sStack_5a0);
          local_10f0 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_10e8 = "";
          local_1100 = &boost::unit_test::basic_cstring<char_const>::null;
          local_10f8 = &boost::unit_test::basic_cstring<char_const>::null;
          file_57.m_end = (iterator)0x249;
          file_57.m_begin = (iterator)&local_10f0;
          msg_57.m_end = pvVar21;
          msg_57.m_begin = pvVar20;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_57,
                     (size_t)&local_1100,msg_57);
          local_c18._8_8_ = local_c18._9_8_ << 8;
          local_c18._0_8_ = &PTR__lazy_ostream_013abb30;
          sStack_c08.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_c00 = (_Base_ptr)0xf6cf21;
          local_5e0._0_4_ =
               Find<transaction_identifier<false>,unsigned_int>
                         ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                           *)map,&(tx6.
                                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->hash);
          very_high_feerate.nSatoshisPerK._0_4_ = 4;
          local_5b0[0] = (class_property<bool>)(class_property<bool>)(local_5e0._0_4_ == 4);
          local_5b0._8_8_ = (element_type *)0x0;
          sStack_5a0.pi_ = (sp_counted_base *)0x0;
          tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value = (long)anon_var_dwarf_d30e50;
          tx3_bump_fee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._8_8_ =
               (long)
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
               + 0x68;
          tx6_tx7_bumpfee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value = (long)local_5e0;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ << 8;
          bump_fees._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abbb0;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)boost::unit_test::lazy_ostream::inst;
          bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)&tx6_tx7_bumpfee;
          just_below_tx4.nSatoshisPerK = (CAmount)&very_high_feerate;
          local_5d0._8_8_ = local_5d0._9_8_ << 8;
          local_5d0._0_8_ = &PTR__lazy_ostream_013abcf0;
          sStack_5c0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_5b8 = (_Base_ptr)&just_below_tx4;
          pvVar20 = (iterator)0x1;
          pvVar21 = (iterator)0x2;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_5b0,(lazy_ostream *)local_c18,1,2,REQUIRE,0xea3da8,
                     (size_t)&tx3_bump_fee,0x249,&bump_fees,"4",local_5d0);
          boost::detail::shared_count::~shared_count(&sStack_5a0);
          lVar18 = lVar18 + 0x30;
        } while (lVar18 != 0x60);
        lVar18 = 0x30;
        do {
          std::
          _Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_unsigned_int>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_unsigned_int>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
          ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_unsigned_int>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_unsigned_int>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                       *)(&mini_miner_tx6_tx7.m_ready_to_calculate + lVar18));
          lVar18 = lVar18 + -0x30;
        } while (lVar18 != -0x30);
        std::
        _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>_>
        ::~_Rb_tree(&miniminer_pool.m_descendant_set_by_txid._M_t);
        if (miniminer_pool.m_entries.
            super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(miniminer_pool.m_entries.
                          super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)miniminer_pool.m_entries.
                                super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)miniminer_pool.m_entries.
                                super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        _Rb_tree<uint256,_std::pair<const_uint256,_node::MiniMinerMempoolEntry>,_std::_Select1st<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
        ::~_Rb_tree(&miniminer_pool.m_entries_by_txid._M_t);
        std::
        _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
        ::~_Rb_tree(&miniminer_pool.m_in_block._M_t);
        std::
        _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
        ::~_Rb_tree(&miniminer_pool.m_bump_fees._M_t);
        std::
        _Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_unsigned_int>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_unsigned_int>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
        ::~_Rb_tree(&miniminer_pool.m_inclusion_order._M_t);
        std::
        _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>_>
        ::~_Rb_tree(&miniminer_pool.m_requested_outpoints_by_txid._M_t);
        std::
        _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
        ::~_Rb_tree(&miniminer_pool.m_to_be_replaced._M_t);
        std::
        _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>_>
        ::~_Rb_tree(&miniminer_manual.m_descendant_set_by_txid._M_t);
        if (miniminer_manual.m_entries.
            super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(miniminer_manual.m_entries.
                          super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          CONCAT44(miniminer_manual.m_entries.
                                   super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                   miniminer_manual.m_entries.
                                   super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) -
                          (long)miniminer_manual.m_entries.
                                super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        _Rb_tree<uint256,_std::pair<const_uint256,_node::MiniMinerMempoolEntry>,_std::_Select1st<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
        ::~_Rb_tree(&miniminer_manual.m_entries_by_txid._M_t);
        std::
        _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
        ::~_Rb_tree(&miniminer_manual.m_in_block._M_t);
        std::
        _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
        ::~_Rb_tree(&miniminer_manual.m_bump_fees._M_t);
        std::
        _Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_unsigned_int>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_unsigned_int>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
        ::~_Rb_tree(&miniminer_manual.m_inclusion_order._M_t);
        std::
        _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>_>
        ::~_Rb_tree(&miniminer_manual.m_requested_outpoints_by_txid._M_t);
        std::
        _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
        ::~_Rb_tree(&miniminer_manual.m_to_be_replaced._M_t);
        std::
        _Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
        ::~_Rb_tree(&descendant_caches._M_t);
        std::vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>::
        ~vector(&miniminer_info);
        if (all_unspent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(all_unspent_outpoints.
                          super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)all_unspent_outpoints.
                                super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)all_unspent_outpoints.
                                super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)tx_vsizes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::~vector(&all_transactions);
        if (tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
        std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          return;
        }
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(miniminer_overlap, TestChain100Setup)
{
/*      Tx graph for `miniminer_overlap` unit test:
 *
 *     coinbase_tx [mined]        ... block-chain
 *  -------------------------------------------------
 *      /   |   \          \      ... mempool
 *     /    |    \         |
 *   tx0   tx1   tx2      tx4
 *  [low] [med] [high]   [high]
 *     \    |    /         |
 *      \   |   /         tx5
 *       \  |  /         [low]
 *         tx3          /     \
 *        [high]       tx6    tx7
 *                    [med]  [high]
 *
 *  NOTE:
 *  -> "low"/"med"/"high" denote the _absolute_ fee of each tx
 *  -> tx3 has 3 inputs and 3 outputs, all other txs have 1 input and 2 outputs
 *  -> tx3's feerate is lower than tx2's, as tx3 has more weight (due to having more inputs and outputs)
 *
 *  -> tx2_FR = high / tx2_vsize
 *  -> tx3_FR = high / tx3_vsize
 *  -> tx3_ASFR = (low+med+high+high) / (tx0_vsize + tx1_vsize + tx2_vsize + tx3_vsize)
 *  -> tx4_FR = high / tx4_vsize
 *  -> tx6_ASFR = (high+low+med) / (tx4_vsize + tx5_vsize + tx6_vsize)
 *  -> tx7_ASFR = (high+low+high) / (tx4_vsize + tx5_vsize + tx7_vsize) */

    CTxMemPool& pool = *Assert(m_node.mempool);
    LOCK2(::cs_main, pool.cs);
    TestMemPoolEntryHelper entry;

    // Create 3 parents of different feerates, and 1 child spending outputs from all 3 parents.
    const auto tx0 = make_tx({COutPoint{m_coinbase_txns[0]->GetHash(), 0}}, /*num_outputs=*/2);
    pool.addUnchecked(entry.Fee(low_fee).FromTx(tx0));
    const auto tx1 = make_tx({COutPoint{m_coinbase_txns[1]->GetHash(), 0}}, /*num_outputs=*/2);
    pool.addUnchecked(entry.Fee(med_fee).FromTx(tx1));
    const auto tx2 = make_tx({COutPoint{m_coinbase_txns[2]->GetHash(), 0}}, /*num_outputs=*/2);
    pool.addUnchecked(entry.Fee(high_fee).FromTx(tx2));
    const auto tx3 = make_tx({COutPoint{tx0->GetHash(), 0}, COutPoint{tx1->GetHash(), 0}, COutPoint{tx2->GetHash(), 0}}, /*num_outputs=*/3);
    pool.addUnchecked(entry.Fee(high_fee).FromTx(tx3));

    // Create 1 grandparent and 1 parent, then 2 children.
    const auto tx4 = make_tx({COutPoint{m_coinbase_txns[3]->GetHash(), 0}}, /*num_outputs=*/2);
    pool.addUnchecked(entry.Fee(high_fee).FromTx(tx4));
    const auto tx5 = make_tx({COutPoint{tx4->GetHash(), 0}}, /*num_outputs=*/3);
    pool.addUnchecked(entry.Fee(low_fee).FromTx(tx5));
    const auto tx6 = make_tx({COutPoint{tx5->GetHash(), 0}}, /*num_outputs=*/2);
    pool.addUnchecked(entry.Fee(med_fee).FromTx(tx6));
    const auto tx7 = make_tx({COutPoint{tx5->GetHash(), 1}}, /*num_outputs=*/2);
    pool.addUnchecked(entry.Fee(high_fee).FromTx(tx7));

    std::vector<CTransactionRef> all_transactions{tx0, tx1, tx2, tx3, tx4, tx5, tx6, tx7};
    std::vector<int64_t> tx_vsizes;
    tx_vsizes.reserve(all_transactions.size());
    for (const auto& tx : all_transactions) tx_vsizes.push_back(GetVirtualTransactionSize(*tx));

    std::vector<COutPoint> all_unspent_outpoints({
        COutPoint{tx0->GetHash(), 1},
        COutPoint{tx1->GetHash(), 1},
        COutPoint{tx2->GetHash(), 1},
        COutPoint{tx3->GetHash(), 0},
        COutPoint{tx3->GetHash(), 1},
        COutPoint{tx3->GetHash(), 2},
        COutPoint{tx4->GetHash(), 1},
        COutPoint{tx5->GetHash(), 2},
        COutPoint{tx6->GetHash(), 0},
        COutPoint{tx7->GetHash(), 0}
    });
    for (const auto& outpoint : all_unspent_outpoints) BOOST_CHECK(!pool.isSpent(outpoint));

    const auto tx2_feerate = CFeeRate(high_fee, tx_vsizes[2]);
    const auto tx3_feerate = CFeeRate(high_fee, tx_vsizes[3]);
    // tx3's feerate is lower than tx2's. same fee, different weight.
    BOOST_CHECK(tx2_feerate > tx3_feerate);
    const auto tx3_anc_feerate = CFeeRate(low_fee + med_fee + high_fee + high_fee, tx_vsizes[0] + tx_vsizes[1] + tx_vsizes[2] + tx_vsizes[3]);
    const auto& tx3_entry{*Assert(pool.GetEntry(tx3->GetHash()))};
    BOOST_CHECK(tx3_anc_feerate == CFeeRate(tx3_entry.GetModFeesWithAncestors(), tx3_entry.GetSizeWithAncestors()));
    const auto tx4_feerate = CFeeRate(high_fee, tx_vsizes[4]);
    const auto tx6_anc_feerate = CFeeRate(high_fee + low_fee + med_fee, tx_vsizes[4] + tx_vsizes[5] + tx_vsizes[6]);
    const auto& tx6_entry{*Assert(pool.GetEntry(tx6->GetHash()))};
    BOOST_CHECK(tx6_anc_feerate == CFeeRate(tx6_entry.GetModFeesWithAncestors(), tx6_entry.GetSizeWithAncestors()));
    const auto tx7_anc_feerate = CFeeRate(high_fee + low_fee + high_fee, tx_vsizes[4] + tx_vsizes[5] + tx_vsizes[7]);
    const auto& tx7_entry{*Assert(pool.GetEntry(tx7->GetHash()))};
    BOOST_CHECK(tx7_anc_feerate == CFeeRate(tx7_entry.GetModFeesWithAncestors(), tx7_entry.GetSizeWithAncestors()));
    BOOST_CHECK(tx4_feerate > tx6_anc_feerate);
    BOOST_CHECK(tx4_feerate > tx7_anc_feerate);

    // Extremely high feerate: everybody's bumpfee is from their full ancestor set.
    {
        node::MiniMiner mini_miner(pool, all_unspent_outpoints);
        const CFeeRate very_high_feerate(COIN);
        BOOST_CHECK(tx3_anc_feerate < very_high_feerate);
        BOOST_CHECK(mini_miner.IsReadyToCalculate());
        auto bump_fees = mini_miner.CalculateBumpFees(very_high_feerate);
        BOOST_CHECK_EQUAL(bump_fees.size(), all_unspent_outpoints.size());
        BOOST_CHECK(!mini_miner.IsReadyToCalculate());
        BOOST_CHECK(sanity_check(all_transactions, bump_fees));
        const auto tx0_bumpfee = bump_fees.find(COutPoint{tx0->GetHash(), 1});
        BOOST_CHECK(tx0_bumpfee != bump_fees.end());
        BOOST_CHECK_EQUAL(tx0_bumpfee->second, very_high_feerate.GetFee(tx_vsizes[0]) - low_fee);
        const auto tx3_bumpfee = bump_fees.find(COutPoint{tx3->GetHash(), 0});
        BOOST_CHECK(tx3_bumpfee != bump_fees.end());
        BOOST_CHECK_EQUAL(tx3_bumpfee->second,
            very_high_feerate.GetFee(tx_vsizes[0] + tx_vsizes[1] + tx_vsizes[2] + tx_vsizes[3]) - (low_fee + med_fee + high_fee + high_fee));
        const auto tx6_bumpfee = bump_fees.find(COutPoint{tx6->GetHash(), 0});
        BOOST_CHECK(tx6_bumpfee != bump_fees.end());
        BOOST_CHECK_EQUAL(tx6_bumpfee->second,
            very_high_feerate.GetFee(tx_vsizes[4] + tx_vsizes[5] + tx_vsizes[6]) - (high_fee + low_fee + med_fee));
        const auto tx7_bumpfee = bump_fees.find(COutPoint{tx7->GetHash(), 0});
        BOOST_CHECK(tx7_bumpfee != bump_fees.end());
        BOOST_CHECK_EQUAL(tx7_bumpfee->second,
            very_high_feerate.GetFee(tx_vsizes[4] + tx_vsizes[5] + tx_vsizes[7]) - (high_fee + low_fee + high_fee));
        // Total fees: if spending multiple outputs from tx3 don't double-count fees.
        node::MiniMiner mini_miner_total_tx3(pool, {COutPoint{tx3->GetHash(), 0}, COutPoint{tx3->GetHash(), 1}});
        BOOST_CHECK(mini_miner_total_tx3.IsReadyToCalculate());
        const auto tx3_bump_fee = mini_miner_total_tx3.CalculateTotalBumpFees(very_high_feerate);
        BOOST_CHECK(!mini_miner_total_tx3.IsReadyToCalculate());
        BOOST_CHECK(tx3_bump_fee.has_value());
        BOOST_CHECK_EQUAL(tx3_bump_fee.value(),
            very_high_feerate.GetFee(tx_vsizes[0] + tx_vsizes[1] + tx_vsizes[2] + tx_vsizes[3]) - (low_fee + med_fee + high_fee + high_fee));
        // Total fees: if spending both tx6 and tx7, don't double-count fees.
        node::MiniMiner mini_miner_tx6_tx7(pool, {COutPoint{tx6->GetHash(), 0}, COutPoint{tx7->GetHash(), 0}});
        BOOST_CHECK(mini_miner_tx6_tx7.IsReadyToCalculate());
        const auto tx6_tx7_bumpfee = mini_miner_tx6_tx7.CalculateTotalBumpFees(very_high_feerate);
        BOOST_CHECK(!mini_miner_tx6_tx7.IsReadyToCalculate());
        BOOST_CHECK(tx6_tx7_bumpfee.has_value());
        BOOST_CHECK_EQUAL(tx6_tx7_bumpfee.value(),
            very_high_feerate.GetFee(tx_vsizes[4] + tx_vsizes[5] + tx_vsizes[6] + tx_vsizes[7]) - (high_fee + low_fee + med_fee + high_fee));
    }
    // Feerate just below tx4: tx6 and tx7 have different bump fees.
    {
        const auto just_below_tx4 = CFeeRate(tx4_feerate.GetFeePerK() - 5);
        node::MiniMiner mini_miner(pool, all_unspent_outpoints);
        BOOST_CHECK(mini_miner.IsReadyToCalculate());
        auto bump_fees = mini_miner.CalculateBumpFees(just_below_tx4);
        BOOST_CHECK(!mini_miner.IsReadyToCalculate());
        BOOST_CHECK_EQUAL(bump_fees.size(), all_unspent_outpoints.size());
        BOOST_CHECK(sanity_check(all_transactions, bump_fees));
        const auto tx6_bumpfee = bump_fees.find(COutPoint{tx6->GetHash(), 0});
        BOOST_CHECK(tx6_bumpfee != bump_fees.end());
        BOOST_CHECK_EQUAL(tx6_bumpfee->second, just_below_tx4.GetFee(tx_vsizes[5] + tx_vsizes[6]) - (low_fee + med_fee));
        const auto tx7_bumpfee = bump_fees.find(COutPoint{tx7->GetHash(), 0});
        BOOST_CHECK(tx7_bumpfee != bump_fees.end());
        BOOST_CHECK_EQUAL(tx7_bumpfee->second, just_below_tx4.GetFee(tx_vsizes[5] + tx_vsizes[7]) - (low_fee + high_fee));
        // Total fees: if spending both tx6 and tx7, don't double-count fees.
        node::MiniMiner mini_miner_tx6_tx7(pool, {COutPoint{tx6->GetHash(), 0}, COutPoint{tx7->GetHash(), 0}});
        BOOST_CHECK(mini_miner_tx6_tx7.IsReadyToCalculate());
        const auto tx6_tx7_bumpfee = mini_miner_tx6_tx7.CalculateTotalBumpFees(just_below_tx4);
        BOOST_CHECK(!mini_miner_tx6_tx7.IsReadyToCalculate());
        BOOST_CHECK(tx6_tx7_bumpfee.has_value());
        BOOST_CHECK_EQUAL(tx6_tx7_bumpfee.value(), just_below_tx4.GetFee(tx_vsizes[5] + tx_vsizes[6]) - (low_fee + med_fee));
    }
    // Feerate between tx6 and tx7's ancestor feerates: don't need to bump tx5 because tx7 already does.
    {
        const auto just_above_tx6 = CFeeRate(med_fee + 10, tx_vsizes[6]);
        BOOST_CHECK(just_above_tx6 <= CFeeRate(low_fee + high_fee, tx_vsizes[5] + tx_vsizes[7]));
        node::MiniMiner mini_miner(pool, all_unspent_outpoints);
        BOOST_CHECK(mini_miner.IsReadyToCalculate());
        auto bump_fees = mini_miner.CalculateBumpFees(just_above_tx6);
        BOOST_CHECK(!mini_miner.IsReadyToCalculate());
        BOOST_CHECK_EQUAL(bump_fees.size(), all_unspent_outpoints.size());
        BOOST_CHECK(sanity_check(all_transactions, bump_fees));
        const auto tx6_bumpfee = bump_fees.find(COutPoint{tx6->GetHash(), 0});
        BOOST_CHECK(tx6_bumpfee != bump_fees.end());
        BOOST_CHECK_EQUAL(tx6_bumpfee->second, just_above_tx6.GetFee(tx_vsizes[6]) - (med_fee));
        const auto tx7_bumpfee = bump_fees.find(COutPoint{tx7->GetHash(), 0});
        BOOST_CHECK(tx7_bumpfee != bump_fees.end());
        BOOST_CHECK_EQUAL(tx7_bumpfee->second, 0);
    }
    // Check linearization order
    std::vector<node::MiniMinerMempoolEntry> miniminer_info;
    miniminer_info.emplace_back(tx0,/*vsize_self=*/tx_vsizes[0],                     /*vsize_ancestor=*/tx_vsizes[0], /*fee_self=*/low_fee,   /*fee_ancestor=*/low_fee);
    miniminer_info.emplace_back(tx1,               tx_vsizes[1],                                        tx_vsizes[1],              med_fee,                    med_fee);
    miniminer_info.emplace_back(tx2,               tx_vsizes[2],                                        tx_vsizes[2],             high_fee,                   high_fee);
    miniminer_info.emplace_back(tx3,               tx_vsizes[3], tx_vsizes[0]+tx_vsizes[1]+tx_vsizes[2]+tx_vsizes[3],             high_fee, low_fee+med_fee+2*high_fee);
    miniminer_info.emplace_back(tx4,               tx_vsizes[4],                                        tx_vsizes[4],             high_fee,                   high_fee);
    miniminer_info.emplace_back(tx5,               tx_vsizes[5],                           tx_vsizes[4]+tx_vsizes[5],              low_fee,         low_fee + high_fee);
    miniminer_info.emplace_back(tx6,               tx_vsizes[6],              tx_vsizes[4]+tx_vsizes[5]+tx_vsizes[6],              med_fee,   high_fee+low_fee+med_fee);
    miniminer_info.emplace_back(tx7,               tx_vsizes[7],              tx_vsizes[4]+tx_vsizes[5]+tx_vsizes[7],             high_fee,  high_fee+low_fee+high_fee);

    std::map<Txid, std::set<Txid>> descendant_caches;
    descendant_caches.emplace(tx0->GetHash(), std::set<Txid>{tx0->GetHash(), tx3->GetHash()});
    descendant_caches.emplace(tx1->GetHash(), std::set<Txid>{tx1->GetHash(), tx3->GetHash()});
    descendant_caches.emplace(tx2->GetHash(), std::set<Txid>{tx2->GetHash(), tx3->GetHash()});
    descendant_caches.emplace(tx3->GetHash(), std::set<Txid>{tx3->GetHash()});
    descendant_caches.emplace(tx4->GetHash(), std::set<Txid>{tx4->GetHash(), tx5->GetHash(), tx6->GetHash(), tx7->GetHash()});
    descendant_caches.emplace(tx5->GetHash(), std::set<Txid>{tx5->GetHash(), tx6->GetHash(), tx7->GetHash()});
    descendant_caches.emplace(tx6->GetHash(), std::set<Txid>{tx6->GetHash()});
    descendant_caches.emplace(tx7->GetHash(), std::set<Txid>{tx7->GetHash()});

    node::MiniMiner miniminer_manual(miniminer_info, descendant_caches);
    // Use unspent outpoints to avoid entries being omitted.
    node::MiniMiner miniminer_pool(pool, all_unspent_outpoints);
    BOOST_CHECK(miniminer_manual.IsReadyToCalculate());
    BOOST_CHECK(miniminer_pool.IsReadyToCalculate());
    for (const auto& sequences : {miniminer_manual.Linearize(), miniminer_pool.Linearize()}) {
        // tx2 and tx4 selected first: high feerate with nothing to bump
        BOOST_CHECK_EQUAL(Find(sequences, tx4->GetHash()), 0);
        BOOST_CHECK_EQUAL(Find(sequences, tx2->GetHash()), 1);

        // tx5 + tx7 CPFP
        BOOST_CHECK_EQUAL(Find(sequences, tx5->GetHash()), 2);
        BOOST_CHECK_EQUAL(Find(sequences, tx7->GetHash()), 2);

        // tx0 and tx1 CPFP'd by tx3
        BOOST_CHECK_EQUAL(Find(sequences, tx0->GetHash()), 3);
        BOOST_CHECK_EQUAL(Find(sequences, tx1->GetHash()), 3);
        BOOST_CHECK_EQUAL(Find(sequences, tx3->GetHash()), 3);

        // tx6 at medium feerate
        BOOST_CHECK_EQUAL(Find(sequences, tx6->GetHash()), 4);
    }
}